

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O3

void embree::avx2::CurveNiIntersector1<4>::
     intersect_n<embree::avx2::OrientedCurve1Intersector1<embree::BezierCurveT,7,8>,embree::avx2::Intersect1Epilog1<true>>
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *prim)

{
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar1;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar2;
  Primitive PVar3;
  Geometry *pGVar4;
  RTCFilterFunctionN p_Var5;
  void *pvVar6;
  __int_type_conflict _Var7;
  undefined1 auVar8 [32];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  int iVar17;
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  uint uVar49;
  ulong uVar50;
  long lVar51;
  byte bVar52;
  uint uVar53;
  uint uVar54;
  uint uVar55;
  ulong uVar56;
  ulong uVar57;
  float fVar58;
  float fVar59;
  undefined4 uVar60;
  float fVar61;
  float fVar90;
  vint4 bi_2;
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  float fVar91;
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined8 uVar92;
  vint4 bi_1;
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  float fVar118;
  vint4 ai_2;
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  vint4 ai;
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [32];
  undefined1 auVar141 [64];
  float fVar142;
  float fVar143;
  float fVar162;
  float fVar163;
  vint4 bi;
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  float fVar164;
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [32];
  undefined1 auVar161 [64];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [32];
  undefined1 auVar178 [64];
  float fVar179;
  float fVar192;
  float fVar193;
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  float fVar194;
  undefined1 auVar190 [32];
  undefined1 auVar191 [64];
  vint4 ai_1;
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [32];
  undefined1 auVar203 [32];
  undefined1 auVar204 [64];
  float fVar217;
  vfloat4 a0_3;
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [32];
  undefined1 auVar216 [64];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [64];
  vfloat4 a0_1;
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [64];
  float fVar240;
  float fVar251;
  float fVar252;
  vfloat4 a0;
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar241 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [32];
  undefined1 auVar248 [32];
  undefined1 auVar249 [32];
  float fVar253;
  undefined1 auVar250 [64];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [32];
  undefined1 auVar261 [64];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [32];
  undefined1 auVar268 [32];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar273 [32];
  vfloat_impl<4> p01;
  vfloat_impl<4> p00;
  vfloat_impl<4> p02;
  vfloat_impl<4> p03;
  RTCFilterFunctionNArguments args;
  uint mask_stack [4];
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  int local_51c;
  undefined1 local_518 [8];
  float fStack_510;
  float fStack_50c;
  undefined1 local_508 [8];
  undefined8 uStack_500;
  undefined8 uStack_4f8;
  undefined8 uStack_4f0;
  undefined1 local_4e8 [16];
  undefined1 local_4d8 [16];
  undefined1 local_4c8 [16];
  undefined1 local_4b8 [16];
  ulong local_4a0;
  float local_498;
  float fStack_494;
  float fStack_490;
  float fStack_48c;
  undefined1 local_488 [16];
  undefined1 local_478 [16];
  undefined1 local_468 [8];
  float fStack_460;
  float fStack_45c;
  undefined1 local_458 [8];
  float fStack_450;
  float fStack_44c;
  undefined1 local_448 [16];
  undefined1 local_438 [16];
  undefined1 local_428 [16];
  undefined1 local_418 [8];
  float fStack_410;
  float fStack_40c;
  undefined1 local_408 [16];
  uint local_3f8;
  uint uStack_3f4;
  uint uStack_3f0;
  uint uStack_3ec;
  undefined1 local_3e8 [8];
  float fStack_3e0;
  float fStack_3dc;
  undefined1 local_3d8 [16];
  undefined1 local_3c8 [16];
  undefined1 local_3b8 [16];
  undefined1 local_3a8 [32];
  undefined1 local_388 [16];
  undefined1 local_378 [8];
  float fStack_370;
  float fStack_36c;
  RTCFilterFunctionNArguments local_368;
  undefined1 local_338 [8];
  float fStack_330;
  float fStack_32c;
  undefined1 auStack_328 [16];
  undefined1 local_318 [32];
  undefined1 local_2f8 [16];
  undefined1 local_2e8 [8];
  float fStack_2e0;
  float fStack_2dc;
  float fStack_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  uint auStack_2c8 [4];
  undefined8 local_2b8;
  float local_2b0;
  undefined8 local_2ac;
  uint local_2a4;
  uint local_2a0;
  uint local_29c;
  uint local_298;
  undefined1 local_288 [16];
  undefined1 local_278 [8];
  float fStack_270;
  float fStack_26c;
  undefined1 local_268 [16];
  undefined1 local_258 [16];
  undefined1 local_248 [16];
  undefined1 local_238 [16];
  undefined1 local_228 [16];
  undefined1 local_218 [16];
  undefined1 local_208 [16];
  undefined1 local_1f8 [32];
  uint local_1d8;
  uint uStack_1d4;
  uint uStack_1d0;
  uint uStack_1cc;
  uint uStack_1c8;
  uint uStack_1c4;
  uint uStack_1c0;
  uint uStack_1bc;
  float local_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  float fStack_1a0;
  float fStack_19c;
  uint uStack_198;
  float afStack_194 [7];
  undefined1 local_178 [32];
  undefined1 local_158 [32];
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float fStack_128;
  float fStack_124;
  float fStack_120;
  float fStack_11c;
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  float fStack_100;
  undefined4 uStack_fc;
  undefined1 local_f8 [32];
  undefined1 local_d8 [32];
  undefined1 local_b8 [32];
  undefined1 local_98 [32];
  undefined1 local_78 [32];
  ulong auStack_58 [5];
  undefined1 auVar272 [32];
  
  PVar3 = prim[1];
  uVar56 = (ulong)(byte)PVar3;
  fVar58 = *(float *)(prim + uVar56 * 0x19 + 0x12);
  auVar12 = vsubps_avx((undefined1  [16])(ray->super_RayK<1>).org.field_0,
                       *(undefined1 (*) [16])(prim + uVar56 * 0x19 + 6));
  auVar62._0_4_ = fVar58 * auVar12._0_4_;
  auVar62._4_4_ = fVar58 * auVar12._4_4_;
  auVar62._8_4_ = fVar58 * auVar12._8_4_;
  auVar62._12_4_ = fVar58 * auVar12._12_4_;
  auVar144._0_4_ = fVar58 * (ray->super_RayK<1>).dir.field_0.m128[0];
  auVar144._4_4_ = fVar58 * (ray->super_RayK<1>).dir.field_0.m128[1];
  auVar144._8_4_ = fVar58 * (ray->super_RayK<1>).dir.field_0.m128[2];
  auVar144._12_4_ = fVar58 * (ray->super_RayK<1>).dir.field_0.m128[3];
  auVar12 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar56 * 4 + 6)));
  auVar12 = vcvtdq2ps_avx(auVar12);
  auVar9 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar56 * 5 + 6)));
  auVar9 = vcvtdq2ps_avx(auVar9);
  auVar125 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar56 * 6 + 6)));
  auVar125 = vcvtdq2ps_avx(auVar125);
  auVar10 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar56 * 0xb + 6)));
  auVar10 = vcvtdq2ps_avx(auVar10);
  auVar11 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)((uint)(byte)PVar3 * 0xc) + 6)));
  auVar11 = vcvtdq2ps_avx(auVar11);
  auVar243 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (uint)(byte)PVar3 * 0xc + uVar56 + 6)));
  auVar243 = vcvtdq2ps_avx(auVar243);
  uVar50 = (ulong)(uint)((int)(uVar56 * 9) * 2);
  auVar65 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar50 + 6)));
  auVar65 = vcvtdq2ps_avx(auVar65);
  auVar64 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar50 + uVar56 + 6)));
  auVar64 = vcvtdq2ps_avx(auVar64);
  uVar50 = (ulong)(uint)((int)(uVar56 * 5) << 2);
  auVar234 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar50 + 6)));
  auVar234 = vcvtdq2ps_avx(auVar234);
  auVar262._4_4_ = auVar144._0_4_;
  auVar262._0_4_ = auVar144._0_4_;
  auVar262._8_4_ = auVar144._0_4_;
  auVar262._12_4_ = auVar144._0_4_;
  auVar94 = vshufps_avx(auVar144,auVar144,0x55);
  auVar63 = vshufps_avx(auVar144,auVar144,0xaa);
  fVar58 = auVar63._0_4_;
  auVar231._0_4_ = fVar58 * auVar125._0_4_;
  fVar90 = auVar63._4_4_;
  auVar231._4_4_ = fVar90 * auVar125._4_4_;
  fVar118 = auVar63._8_4_;
  auVar231._8_4_ = fVar118 * auVar125._8_4_;
  fVar91 = auVar63._12_4_;
  auVar231._12_4_ = fVar91 * auVar125._12_4_;
  auVar218._0_4_ = auVar243._0_4_ * fVar58;
  auVar218._4_4_ = auVar243._4_4_ * fVar90;
  auVar218._8_4_ = auVar243._8_4_ * fVar118;
  auVar218._12_4_ = auVar243._12_4_ * fVar91;
  auVar195._0_4_ = auVar234._0_4_ * fVar58;
  auVar195._4_4_ = auVar234._4_4_ * fVar90;
  auVar195._8_4_ = auVar234._8_4_ * fVar118;
  auVar195._12_4_ = auVar234._12_4_ * fVar91;
  auVar63 = vfmadd231ps_fma(auVar231,auVar94,auVar9);
  auVar122 = vfmadd231ps_fma(auVar218,auVar94,auVar11);
  auVar94 = vfmadd231ps_fma(auVar195,auVar64,auVar94);
  auVar119 = vfmadd231ps_fma(auVar63,auVar262,auVar12);
  auVar122 = vfmadd231ps_fma(auVar122,auVar262,auVar10);
  auVar132 = vfmadd231ps_fma(auVar94,auVar65,auVar262);
  auVar263._4_4_ = auVar62._0_4_;
  auVar263._0_4_ = auVar62._0_4_;
  auVar263._8_4_ = auVar62._0_4_;
  auVar263._12_4_ = auVar62._0_4_;
  auVar94 = vshufps_avx(auVar62,auVar62,0x55);
  auVar63 = vshufps_avx(auVar62,auVar62,0xaa);
  fVar58 = auVar63._0_4_;
  auVar145._0_4_ = fVar58 * auVar125._0_4_;
  fVar90 = auVar63._4_4_;
  auVar145._4_4_ = fVar90 * auVar125._4_4_;
  fVar118 = auVar63._8_4_;
  auVar145._8_4_ = fVar118 * auVar125._8_4_;
  fVar91 = auVar63._12_4_;
  auVar145._12_4_ = fVar91 * auVar125._12_4_;
  auVar93._0_4_ = auVar243._0_4_ * fVar58;
  auVar93._4_4_ = auVar243._4_4_ * fVar90;
  auVar93._8_4_ = auVar243._8_4_ * fVar118;
  auVar93._12_4_ = auVar243._12_4_ * fVar91;
  auVar63._0_4_ = auVar234._0_4_ * fVar58;
  auVar63._4_4_ = auVar234._4_4_ * fVar90;
  auVar63._8_4_ = auVar234._8_4_ * fVar118;
  auVar63._12_4_ = auVar234._12_4_ * fVar91;
  auVar9 = vfmadd231ps_fma(auVar145,auVar94,auVar9);
  auVar125 = vfmadd231ps_fma(auVar93,auVar94,auVar11);
  auVar11 = vfmadd231ps_fma(auVar63,auVar94,auVar64);
  auVar243 = vfmadd231ps_fma(auVar9,auVar263,auVar12);
  auVar64 = vfmadd231ps_fma(auVar125,auVar263,auVar10);
  auVar234 = vfmadd231ps_fma(auVar11,auVar263,auVar65);
  local_2f8._8_4_ = 0x7fffffff;
  local_2f8._0_8_ = 0x7fffffff7fffffff;
  local_2f8._12_4_ = 0x7fffffff;
  auVar12 = vandps_avx(auVar119,local_2f8);
  auVar131._8_4_ = 0x219392ef;
  auVar131._0_8_ = 0x219392ef219392ef;
  auVar131._12_4_ = 0x219392ef;
  auVar12 = vcmpps_avx(auVar12,auVar131,1);
  auVar9 = vblendvps_avx(auVar119,auVar131,auVar12);
  auVar12 = vandps_avx(auVar122,local_2f8);
  auVar12 = vcmpps_avx(auVar12,auVar131,1);
  auVar125 = vblendvps_avx(auVar122,auVar131,auVar12);
  auVar12 = vandps_avx(auVar132,local_2f8);
  auVar12 = vcmpps_avx(auVar12,auVar131,1);
  auVar12 = vblendvps_avx(auVar132,auVar131,auVar12);
  auVar10 = vrcpps_avx(auVar9);
  auVar180._8_4_ = 0x3f800000;
  auVar180._0_8_ = 0x3f8000003f800000;
  auVar180._12_4_ = 0x3f800000;
  auVar9 = vfnmadd213ps_fma(auVar9,auVar10,auVar180);
  auVar10 = vfmadd132ps_fma(auVar9,auVar10,auVar10);
  auVar9 = vrcpps_avx(auVar125);
  auVar125 = vfnmadd213ps_fma(auVar125,auVar9,auVar180);
  auVar11 = vfmadd132ps_fma(auVar125,auVar9,auVar9);
  auVar9 = vrcpps_avx(auVar12);
  auVar12 = vfnmadd213ps_fma(auVar12,auVar9,auVar180);
  auVar65 = vfmadd132ps_fma(auVar12,auVar9,auVar9);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + uVar56 * 7 + 6);
  auVar12 = vpmovsxwd_avx(auVar12);
  auVar12 = vcvtdq2ps_avx(auVar12);
  auVar12 = vsubps_avx(auVar12,auVar243);
  auVar132._0_4_ = auVar10._0_4_ * auVar12._0_4_;
  auVar132._4_4_ = auVar10._4_4_ * auVar12._4_4_;
  auVar132._8_4_ = auVar10._8_4_ * auVar12._8_4_;
  auVar132._12_4_ = auVar10._12_4_ * auVar12._12_4_;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + uVar56 * 9 + 6);
  auVar12 = vpmovsxwd_avx(auVar9);
  auVar12 = vcvtdq2ps_avx(auVar12);
  auVar12 = vsubps_avx(auVar12,auVar243);
  auVar146._0_4_ = auVar10._0_4_ * auVar12._0_4_;
  auVar146._4_4_ = auVar10._4_4_ * auVar12._4_4_;
  auVar146._8_4_ = auVar10._8_4_ * auVar12._8_4_;
  auVar146._12_4_ = auVar10._12_4_ * auVar12._12_4_;
  auVar122._1_3_ = 0;
  auVar122[0] = PVar3;
  auVar125._8_8_ = 0;
  auVar125._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar3 * 0x10 + 6);
  auVar9 = vpmovsxwd_avx(auVar125);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar3 * 0x10 + uVar56 * -2 + 6);
  auVar12 = vpmovsxwd_avx(auVar10);
  auVar12 = vcvtdq2ps_avx(auVar12);
  auVar12 = vsubps_avx(auVar12,auVar64);
  auVar196._0_4_ = auVar12._0_4_ * auVar11._0_4_;
  auVar196._4_4_ = auVar12._4_4_ * auVar11._4_4_;
  auVar196._8_4_ = auVar12._8_4_ * auVar11._8_4_;
  auVar196._12_4_ = auVar12._12_4_ * auVar11._12_4_;
  auVar12 = vcvtdq2ps_avx(auVar9);
  auVar12 = vsubps_avx(auVar12,auVar64);
  auVar94._0_4_ = auVar11._0_4_ * auVar12._0_4_;
  auVar94._4_4_ = auVar11._4_4_ * auVar12._4_4_;
  auVar94._8_4_ = auVar11._8_4_ * auVar12._8_4_;
  auVar94._12_4_ = auVar11._12_4_ * auVar12._12_4_;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + uVar50 + uVar56 + 6);
  auVar12 = vpmovsxwd_avx(auVar11);
  auVar12 = vcvtdq2ps_avx(auVar12);
  auVar12 = vsubps_avx(auVar12,auVar234);
  auVar119._0_4_ = auVar65._0_4_ * auVar12._0_4_;
  auVar119._4_4_ = auVar65._4_4_ * auVar12._4_4_;
  auVar119._8_4_ = auVar65._8_4_ * auVar12._8_4_;
  auVar119._12_4_ = auVar65._12_4_ * auVar12._12_4_;
  auVar243._8_8_ = 0;
  auVar243._0_8_ = *(ulong *)(prim + uVar56 * 0x17 + 6);
  auVar12 = vpmovsxwd_avx(auVar243);
  auVar12 = vcvtdq2ps_avx(auVar12);
  auVar12 = vsubps_avx(auVar12,auVar234);
  auVar64._0_4_ = auVar65._0_4_ * auVar12._0_4_;
  auVar64._4_4_ = auVar65._4_4_ * auVar12._4_4_;
  auVar64._8_4_ = auVar65._8_4_ * auVar12._8_4_;
  auVar64._12_4_ = auVar65._12_4_ * auVar12._12_4_;
  auVar12 = vpminsd_avx(auVar132,auVar146);
  auVar9 = vpminsd_avx(auVar196,auVar94);
  auVar12 = vmaxps_avx(auVar12,auVar9);
  auVar9 = vpminsd_avx(auVar119,auVar64);
  uVar60 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
  auVar205._4_4_ = uVar60;
  auVar205._0_4_ = uVar60;
  auVar205._8_4_ = uVar60;
  auVar205._12_4_ = uVar60;
  auVar9 = vmaxps_avx(auVar9,auVar205);
  auVar12 = vmaxps_avx(auVar12,auVar9);
  local_288._0_4_ = auVar12._0_4_ * 0.99999964;
  local_288._4_4_ = auVar12._4_4_ * 0.99999964;
  local_288._8_4_ = auVar12._8_4_ * 0.99999964;
  local_288._12_4_ = auVar12._12_4_ * 0.99999964;
  auVar12 = vpmaxsd_avx(auVar132,auVar146);
  auVar9 = vpmaxsd_avx(auVar196,auVar94);
  auVar12 = vminps_avx(auVar12,auVar9);
  auVar9 = vpmaxsd_avx(auVar119,auVar64);
  fVar58 = (ray->super_RayK<1>).tfar;
  auVar234._4_4_ = fVar58;
  auVar234._0_4_ = fVar58;
  auVar234._8_4_ = fVar58;
  auVar234._12_4_ = fVar58;
  auVar9 = vminps_avx(auVar9,auVar234);
  auVar12 = vminps_avx(auVar12,auVar9);
  auVar65._0_4_ = auVar12._0_4_ * 1.0000004;
  auVar65._4_4_ = auVar12._4_4_ * 1.0000004;
  auVar65._8_4_ = auVar12._8_4_ * 1.0000004;
  auVar65._12_4_ = auVar12._12_4_ * 1.0000004;
  auVar122[4] = PVar3;
  auVar122._5_3_ = 0;
  auVar122[8] = PVar3;
  auVar122._9_3_ = 0;
  auVar122[0xc] = PVar3;
  auVar122._13_3_ = 0;
  auVar9 = vpcmpgtd_avx(auVar122,_DAT_01f7fcf0);
  auVar12 = vcmpps_avx(local_288,auVar65,2);
  auVar12 = vandps_avx(auVar12,auVar9);
  uVar49 = vmovmskps_avx(auVar12);
  if (uVar49 == 0) {
    return;
  }
  uVar49 = uVar49 & 0xff;
  auVar87._16_16_ = mm_lookupmask_ps._240_16_;
  auVar87._0_16_ = mm_lookupmask_ps._240_16_;
  local_178 = vblendps_avx(auVar87,ZEXT832(0) << 0x20,0x80);
  local_3f8 = 0x80000000;
  uStack_3f4 = 0x80000000;
  uStack_3f0 = 0x80000000;
  uStack_3ec = 0x80000000;
  do {
    lVar51 = 0;
    uVar56 = (ulong)uVar49;
    for (uVar50 = uVar56; (uVar50 & 1) == 0; uVar50 = uVar50 >> 1 | 0x8000000000000000) {
      lVar51 = lVar51 + 1;
    }
    uVar49 = *(uint *)(prim + 2);
    pGVar4 = (context->scene->geometries).items[uVar49].ptr;
    local_4a0 = (ulong)*(uint *)(prim + lVar51 * 4 + 6);
    uVar50 = (ulong)*(uint *)(*(long *)&pGVar4->field_0x58 +
                             pGVar4[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                             _M_i * (ulong)*(uint *)(prim + lVar51 * 4 + 6));
    p_Var5 = pGVar4[1].intersectionFilterN;
    pvVar6 = pGVar4[2].userPtr;
    _Var7 = pGVar4[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    auVar12 = *(undefined1 (*) [16])(_Var7 + uVar50 * (long)pvVar6);
    auVar9 = *(undefined1 (*) [16])(_Var7 + (uVar50 + 1) * (long)pvVar6);
    auVar125 = *(undefined1 (*) [16])(_Var7 + (uVar50 + 2) * (long)pvVar6);
    auVar10 = *(undefined1 (*) [16])(_Var7 + (long)pvVar6 * (uVar50 + 3));
    lVar51 = *(long *)&pGVar4[1].time_range.upper;
    auVar11 = *(undefined1 (*) [16])(lVar51 + (long)p_Var5 * uVar50);
    auVar243 = *(undefined1 (*) [16])(lVar51 + (long)p_Var5 * (uVar50 + 1));
    auVar65 = *(undefined1 (*) [16])(lVar51 + (long)p_Var5 * (uVar50 + 2));
    uVar56 = uVar56 - 1 & uVar56;
    auVar64 = *(undefined1 (*) [16])(lVar51 + (long)p_Var5 * (uVar50 + 3));
    if (uVar56 != 0) {
      uVar57 = uVar56 - 1 & uVar56;
      for (uVar50 = uVar56; (uVar50 & 1) == 0; uVar50 = uVar50 >> 1 | 0x8000000000000000) {
      }
      if (uVar57 != 0) {
        for (; (uVar57 & 1) == 0; uVar57 = uVar57 >> 1 | 0x8000000000000000) {
        }
      }
    }
    auVar122 = ZEXT816(0) << 0x40;
    auVar66._0_4_ = auVar64._0_4_ * 0.0;
    auVar66._4_4_ = auVar64._4_4_ * 0.0;
    auVar66._8_4_ = auVar64._8_4_ * 0.0;
    auVar66._12_4_ = auVar64._12_4_ * 0.0;
    auVar94 = vfmadd231ps_fma(auVar66,auVar65,auVar122);
    auVar234 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar243,auVar94);
    local_518._0_4_ = auVar11._0_4_ + auVar234._0_4_;
    local_518._4_4_ = auVar11._4_4_ + auVar234._4_4_;
    fStack_510 = auVar11._8_4_ + auVar234._8_4_;
    fStack_50c = auVar11._12_4_ + auVar234._12_4_;
    auVar254._8_4_ = 0x40400000;
    auVar254._0_8_ = 0x4040000040400000;
    auVar254._12_4_ = 0x40400000;
    auVar234 = vfmadd231ps_fma(auVar94,auVar243,auVar254);
    auVar63 = vfnmadd231ps_fma(auVar234,auVar11,auVar254);
    auVar232._0_4_ = auVar10._0_4_ * 0.0;
    auVar232._4_4_ = auVar10._4_4_ * 0.0;
    auVar232._8_4_ = auVar10._8_4_ * 0.0;
    auVar232._12_4_ = auVar10._12_4_ * 0.0;
    auVar94 = vfmadd231ps_fma(auVar232,auVar125,auVar122);
    auVar234 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar9,auVar94);
    auVar241._0_4_ = auVar12._0_4_ + auVar234._0_4_;
    auVar241._4_4_ = auVar12._4_4_ + auVar234._4_4_;
    auVar241._8_4_ = auVar12._8_4_ + auVar234._8_4_;
    auVar241._12_4_ = auVar12._12_4_ + auVar234._12_4_;
    auVar234 = vfmadd231ps_fma(auVar94,auVar9,auVar254);
    auVar94 = vfnmadd231ps_fma(auVar234,auVar12,auVar254);
    auVar234 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar65,auVar64);
    auVar234 = vfmadd231ps_fma(auVar234,auVar243,auVar122);
    auVar234 = vfmadd231ps_fma(auVar234,auVar11,auVar122);
    auVar120._0_4_ = auVar64._0_4_ * 3.0;
    auVar120._4_4_ = auVar64._4_4_ * 3.0;
    auVar120._8_4_ = auVar64._8_4_ * 3.0;
    auVar120._12_4_ = auVar64._12_4_ * 3.0;
    auVar65 = vfnmadd231ps_fma(auVar120,auVar254,auVar65);
    auVar243 = vfmadd231ps_fma(auVar65,auVar122,auVar243);
    auVar65 = vfnmadd231ps_fma(auVar243,auVar122,auVar11);
    auVar11 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar125,auVar10);
    auVar11 = vfmadd231ps_fma(auVar11,auVar9,auVar122);
    auVar11 = vfmadd231ps_fma(auVar11,auVar12,auVar122);
    auVar206._0_4_ = auVar10._0_4_ * 3.0;
    auVar206._4_4_ = auVar10._4_4_ * 3.0;
    auVar206._8_4_ = auVar10._8_4_ * 3.0;
    auVar206._12_4_ = auVar10._12_4_ * 3.0;
    auVar125 = vfnmadd231ps_fma(auVar206,auVar254,auVar125);
    auVar9 = vfmadd231ps_fma(auVar125,auVar122,auVar9);
    auVar243 = vfnmadd231ps_fma(auVar9,auVar122,auVar12);
    auVar12 = vshufps_avx(auVar63,auVar63,0xc9);
    auVar9 = vshufps_avx(auVar241,auVar241,0xc9);
    fVar59 = auVar63._0_4_;
    auVar147._0_4_ = fVar59 * auVar9._0_4_;
    fVar61 = auVar63._4_4_;
    auVar147._4_4_ = fVar61 * auVar9._4_4_;
    fVar143 = auVar63._8_4_;
    auVar147._8_4_ = fVar143 * auVar9._8_4_;
    fVar217 = auVar63._12_4_;
    auVar147._12_4_ = fVar217 * auVar9._12_4_;
    auVar9 = vfmsub231ps_fma(auVar147,auVar12,auVar241);
    auVar125 = vshufps_avx(auVar9,auVar9,0xc9);
    auVar9 = vshufps_avx(auVar94,auVar94,0xc9);
    auVar148._0_4_ = fVar59 * auVar9._0_4_;
    auVar148._4_4_ = fVar61 * auVar9._4_4_;
    auVar148._8_4_ = fVar143 * auVar9._8_4_;
    auVar148._12_4_ = fVar217 * auVar9._12_4_;
    auVar12 = vfmsub231ps_fma(auVar148,auVar12,auVar94);
    auVar10 = vshufps_avx(auVar12,auVar12,0xc9);
    auVar12 = vshufps_avx(auVar65,auVar65,0xc9);
    auVar9 = vshufps_avx(auVar11,auVar11,0xc9);
    fVar179 = auVar65._0_4_;
    auVar133._0_4_ = fVar179 * auVar9._0_4_;
    fVar192 = auVar65._4_4_;
    auVar133._4_4_ = fVar192 * auVar9._4_4_;
    fVar193 = auVar65._8_4_;
    auVar133._8_4_ = fVar193 * auVar9._8_4_;
    fVar194 = auVar65._12_4_;
    auVar133._12_4_ = fVar194 * auVar9._12_4_;
    auVar9 = vfmsub231ps_fma(auVar133,auVar12,auVar11);
    auVar11 = vshufps_avx(auVar9,auVar9,0xc9);
    auVar9 = vshufps_avx(auVar243,auVar243,0xc9);
    auVar165._0_4_ = fVar179 * auVar9._0_4_;
    auVar165._4_4_ = fVar192 * auVar9._4_4_;
    auVar165._8_4_ = fVar193 * auVar9._8_4_;
    auVar165._12_4_ = fVar194 * auVar9._12_4_;
    auVar9 = vfmsub231ps_fma(auVar165,auVar12,auVar243);
    auVar12 = vdpps_avx(auVar125,auVar125,0x7f);
    auVar243 = vshufps_avx(auVar9,auVar9,0xc9);
    fVar90 = auVar12._0_4_;
    auVar207._4_12_ = ZEXT812(0) << 0x20;
    auVar207._0_4_ = fVar90;
    auVar9 = vrsqrtss_avx(auVar207,auVar207);
    fVar58 = auVar9._0_4_;
    auVar9 = vdpps_avx(auVar125,auVar10,0x7f);
    fVar118 = fVar58 * 1.5 - fVar90 * 0.5 * fVar58 * fVar58 * fVar58;
    fVar142 = fVar118 * auVar125._0_4_;
    fVar162 = fVar118 * auVar125._4_4_;
    fVar163 = fVar118 * auVar125._8_4_;
    fVar164 = fVar118 * auVar125._12_4_;
    auVar219._0_4_ = auVar10._0_4_ * fVar90;
    auVar219._4_4_ = auVar10._4_4_ * fVar90;
    auVar219._8_4_ = auVar10._8_4_ * fVar90;
    auVar219._12_4_ = auVar10._12_4_ * fVar90;
    fVar58 = auVar9._0_4_;
    auVar181._0_4_ = fVar58 * auVar125._0_4_;
    auVar181._4_4_ = fVar58 * auVar125._4_4_;
    auVar181._8_4_ = fVar58 * auVar125._8_4_;
    auVar181._12_4_ = fVar58 * auVar125._12_4_;
    auVar125 = vsubps_avx(auVar219,auVar181);
    auVar9 = vrcpss_avx(auVar207,auVar207);
    auVar12 = vfnmadd213ss_fma(auVar12,auVar9,SUB6416(ZEXT464(0x40000000),0));
    fVar58 = auVar9._0_4_ * auVar12._0_4_;
    auVar12 = vdpps_avx(auVar11,auVar11,0x7f);
    fVar90 = auVar12._0_4_;
    auVar197._4_12_ = ZEXT812(0) << 0x20;
    auVar197._0_4_ = fVar90;
    auVar9 = vrsqrtss_avx(auVar197,auVar197);
    fVar91 = auVar9._0_4_;
    fVar91 = fVar91 * 1.5 - fVar90 * 0.5 * fVar91 * fVar91 * fVar91;
    fVar240 = fVar91 * auVar11._0_4_;
    fVar251 = fVar91 * auVar11._4_4_;
    fVar252 = fVar91 * auVar11._8_4_;
    fVar253 = fVar91 * auVar11._12_4_;
    auVar9 = vdpps_avx(auVar11,auVar243,0x7f);
    auVar166._0_4_ = fVar90 * auVar243._0_4_;
    auVar166._4_4_ = fVar90 * auVar243._4_4_;
    auVar166._8_4_ = fVar90 * auVar243._8_4_;
    auVar166._12_4_ = fVar90 * auVar243._12_4_;
    fVar90 = auVar9._0_4_;
    auVar134._0_4_ = fVar90 * auVar11._0_4_;
    auVar134._4_4_ = fVar90 * auVar11._4_4_;
    auVar134._8_4_ = fVar90 * auVar11._8_4_;
    auVar134._12_4_ = fVar90 * auVar11._12_4_;
    auVar10 = vsubps_avx(auVar166,auVar134);
    auVar9 = vrcpss_avx(auVar197,auVar197);
    auVar12 = vfnmadd213ss_fma(auVar12,auVar9,SUB6416(ZEXT464(0x40000000),0));
    fVar90 = auVar12._0_4_ * auVar9._0_4_;
    auVar12 = vshufps_avx(_local_518,_local_518,0xff);
    auVar198._0_4_ = auVar12._0_4_ * fVar142;
    auVar198._4_4_ = auVar12._4_4_ * fVar162;
    auVar198._8_4_ = auVar12._8_4_ * fVar163;
    auVar198._12_4_ = auVar12._12_4_ * fVar164;
    local_408 = vsubps_avx(_local_518,auVar198);
    auVar9 = vshufps_avx(auVar63,auVar63,0xff);
    auVar149._0_4_ = auVar9._0_4_ * fVar142 + auVar12._0_4_ * fVar118 * fVar58 * auVar125._0_4_;
    auVar149._4_4_ = auVar9._4_4_ * fVar162 + auVar12._4_4_ * fVar118 * fVar58 * auVar125._4_4_;
    auVar149._8_4_ = auVar9._8_4_ * fVar163 + auVar12._8_4_ * fVar118 * fVar58 * auVar125._8_4_;
    auVar149._12_4_ = auVar9._12_4_ * fVar164 + auVar12._12_4_ * fVar118 * fVar58 * auVar125._12_4_;
    auVar125 = vsubps_avx(auVar63,auVar149);
    local_418._0_4_ = auVar198._0_4_ + (float)local_518._0_4_;
    local_418._4_4_ = auVar198._4_4_ + (float)local_518._4_4_;
    fStack_410 = auVar198._8_4_ + fStack_510;
    fStack_40c = auVar198._12_4_ + fStack_50c;
    auVar12 = vshufps_avx(auVar234,auVar234,0xff);
    auVar95._0_4_ = fVar240 * auVar12._0_4_;
    auVar95._4_4_ = fVar251 * auVar12._4_4_;
    auVar95._8_4_ = fVar252 * auVar12._8_4_;
    auVar95._12_4_ = fVar253 * auVar12._12_4_;
    local_428 = vsubps_avx(auVar234,auVar95);
    auVar9 = vshufps_avx(auVar65,auVar65,0xff);
    auVar67._0_4_ = fVar240 * auVar9._0_4_ + auVar12._0_4_ * fVar91 * auVar10._0_4_ * fVar90;
    auVar67._4_4_ = fVar251 * auVar9._4_4_ + auVar12._4_4_ * fVar91 * auVar10._4_4_ * fVar90;
    auVar67._8_4_ = fVar252 * auVar9._8_4_ + auVar12._8_4_ * fVar91 * auVar10._8_4_ * fVar90;
    auVar67._12_4_ = fVar253 * auVar9._12_4_ + auVar12._12_4_ * fVar91 * auVar10._12_4_ * fVar90;
    auVar12 = vsubps_avx(auVar65,auVar67);
    local_498 = auVar234._0_4_ + auVar95._0_4_;
    fStack_494 = auVar234._4_4_ + auVar95._4_4_;
    fStack_490 = auVar234._8_4_ + auVar95._8_4_;
    fStack_48c = auVar234._12_4_ + auVar95._12_4_;
    local_438._0_4_ = local_408._0_4_ + auVar125._0_4_ * 0.33333334;
    local_438._4_4_ = local_408._4_4_ + auVar125._4_4_ * 0.33333334;
    local_438._8_4_ = local_408._8_4_ + auVar125._8_4_ * 0.33333334;
    local_438._12_4_ = local_408._12_4_ + auVar125._12_4_ * 0.33333334;
    auVar68._0_4_ = auVar12._0_4_ * 0.33333334;
    auVar68._4_4_ = auVar12._4_4_ * 0.33333334;
    auVar68._8_4_ = auVar12._8_4_ * 0.33333334;
    auVar68._12_4_ = auVar12._12_4_ * 0.33333334;
    local_448 = vsubps_avx(local_428,auVar68);
    aVar1 = (ray->super_RayK<1>).org.field_0;
    auVar125 = vsubps_avx(local_408,(undefined1  [16])aVar1);
    auVar12 = vshufps_avx(auVar125,auVar125,0x55);
    auVar9 = vshufps_avx(auVar125,auVar125,0xaa);
    aVar2 = (pre->ray_space).vy.field_0;
    fVar58 = (pre->ray_space).vz.field_0.m128[0];
    fVar90 = (pre->ray_space).vz.field_0.m128[1];
    fVar118 = (pre->ray_space).vz.field_0.m128[2];
    fVar91 = (pre->ray_space).vz.field_0.m128[3];
    auVar69._0_4_ = fVar58 * auVar9._0_4_;
    auVar69._4_4_ = fVar90 * auVar9._4_4_;
    auVar69._8_4_ = fVar118 * auVar9._8_4_;
    auVar69._12_4_ = fVar91 * auVar9._12_4_;
    auVar94 = vfmadd231ps_fma(auVar69,(undefined1  [16])aVar2,auVar12);
    auVar10 = vsubps_avx(local_438,(undefined1  [16])aVar1);
    auVar12 = vshufps_avx(auVar10,auVar10,0x55);
    auVar9 = vshufps_avx(auVar10,auVar10,0xaa);
    auVar70._0_4_ = fVar58 * auVar9._0_4_;
    auVar70._4_4_ = fVar90 * auVar9._4_4_;
    auVar70._8_4_ = fVar118 * auVar9._8_4_;
    auVar70._12_4_ = fVar91 * auVar9._12_4_;
    auVar63 = vfmadd231ps_fma(auVar70,(undefined1  [16])aVar2,auVar12);
    auVar9 = vsubps_avx(local_448,(undefined1  [16])aVar1);
    auVar12 = vshufps_avx(auVar9,auVar9,0xaa);
    auVar71._0_4_ = fVar58 * auVar12._0_4_;
    auVar71._4_4_ = fVar90 * auVar12._4_4_;
    auVar71._8_4_ = fVar118 * auVar12._8_4_;
    auVar71._12_4_ = fVar91 * auVar12._12_4_;
    auVar12 = vshufps_avx(auVar9,auVar9,0x55);
    auVar122 = vfmadd231ps_fma(auVar71,(undefined1  [16])aVar2,auVar12);
    auVar11 = vsubps_avx(local_428,(undefined1  [16])aVar1);
    auVar12 = vshufps_avx(auVar11,auVar11,0xaa);
    auVar72._0_4_ = fVar58 * auVar12._0_4_;
    auVar72._4_4_ = fVar90 * auVar12._4_4_;
    auVar72._8_4_ = fVar118 * auVar12._8_4_;
    auVar72._12_4_ = fVar91 * auVar12._12_4_;
    auVar12 = vshufps_avx(auVar11,auVar11,0x55);
    auVar119 = vfmadd231ps_fma(auVar72,(undefined1  [16])aVar2,auVar12);
    auVar243 = vsubps_avx(_local_418,(undefined1  [16])aVar1);
    auVar12 = vshufps_avx(auVar243,auVar243,0xaa);
    auVar150._0_4_ = fVar58 * auVar12._0_4_;
    auVar150._4_4_ = fVar90 * auVar12._4_4_;
    auVar150._8_4_ = fVar118 * auVar12._8_4_;
    auVar150._12_4_ = fVar91 * auVar12._12_4_;
    auVar12 = vshufps_avx(auVar243,auVar243,0x55);
    auVar132 = vfmadd231ps_fma(auVar150,(undefined1  [16])aVar2,auVar12);
    local_458._0_4_ = (fVar59 + auVar149._0_4_) * 0.33333334 + (float)local_418._0_4_;
    local_458._4_4_ = (fVar61 + auVar149._4_4_) * 0.33333334 + (float)local_418._4_4_;
    fStack_450 = (fVar143 + auVar149._8_4_) * 0.33333334 + fStack_410;
    fStack_44c = (fVar217 + auVar149._12_4_) * 0.33333334 + fStack_40c;
    auVar65 = vsubps_avx(_local_458,(undefined1  [16])aVar1);
    auVar12 = vshufps_avx(auVar65,auVar65,0xaa);
    auVar233._0_4_ = fVar58 * auVar12._0_4_;
    auVar233._4_4_ = fVar90 * auVar12._4_4_;
    auVar233._8_4_ = fVar118 * auVar12._8_4_;
    auVar233._12_4_ = fVar91 * auVar12._12_4_;
    auVar12 = vshufps_avx(auVar65,auVar65,0x55);
    auVar62 = vfmadd231ps_fma(auVar233,(undefined1  [16])aVar2,auVar12);
    auVar220._0_4_ = (fVar179 + auVar67._0_4_) * 0.33333334;
    auVar220._4_4_ = (fVar192 + auVar67._4_4_) * 0.33333334;
    auVar220._8_4_ = (fVar193 + auVar67._8_4_) * 0.33333334;
    auVar220._12_4_ = (fVar194 + auVar67._12_4_) * 0.33333334;
    auVar42._4_4_ = fStack_494;
    auVar42._0_4_ = local_498;
    auVar42._8_4_ = fStack_490;
    auVar42._12_4_ = fStack_48c;
    _local_468 = vsubps_avx(auVar42,auVar220);
    auVar64 = vsubps_avx(_local_468,(undefined1  [16])aVar1);
    auVar12 = vshufps_avx(auVar64,auVar64,0xaa);
    auVar221._0_4_ = fVar58 * auVar12._0_4_;
    auVar221._4_4_ = fVar90 * auVar12._4_4_;
    auVar221._8_4_ = fVar118 * auVar12._8_4_;
    auVar221._12_4_ = fVar91 * auVar12._12_4_;
    auVar12 = vshufps_avx(auVar64,auVar64,0x55);
    auVar93 = vfmadd231ps_fma(auVar221,(undefined1  [16])aVar2,auVar12);
    auVar234 = vsubps_avx(auVar42,(undefined1  [16])aVar1);
    auVar12 = vshufps_avx(auVar234,auVar234,0xaa);
    auVar182._0_4_ = fVar58 * auVar12._0_4_;
    auVar182._4_4_ = fVar90 * auVar12._4_4_;
    auVar182._8_4_ = fVar118 * auVar12._8_4_;
    auVar182._12_4_ = fVar91 * auVar12._12_4_;
    auVar12 = vshufps_avx(auVar234,auVar234,0x55);
    auVar12 = vfmadd231ps_fma(auVar182,(undefined1  [16])aVar2,auVar12);
    local_518._0_4_ = auVar125._0_4_;
    auVar167._4_4_ = local_518._0_4_;
    auVar167._0_4_ = local_518._0_4_;
    auVar167._8_4_ = local_518._0_4_;
    auVar167._12_4_ = local_518._0_4_;
    aVar2 = (pre->ray_space).vx.field_0;
    auVar94 = vfmadd231ps_fma(auVar94,(undefined1  [16])aVar2,auVar167);
    local_388._0_4_ = auVar10._0_4_;
    auVar168._4_4_ = local_388._0_4_;
    auVar168._0_4_ = local_388._0_4_;
    auVar168._8_4_ = local_388._0_4_;
    auVar168._12_4_ = local_388._0_4_;
    auVar10 = vfmadd231ps_fma(auVar63,(undefined1  [16])aVar2,auVar168);
    uVar60 = auVar9._0_4_;
    auVar169._4_4_ = uVar60;
    auVar169._0_4_ = uVar60;
    auVar169._8_4_ = uVar60;
    auVar169._12_4_ = uVar60;
    auVar63 = vfmadd231ps_fma(auVar122,(undefined1  [16])aVar2,auVar169);
    uVar60 = auVar11._0_4_;
    auVar170._4_4_ = uVar60;
    auVar170._0_4_ = uVar60;
    auVar170._8_4_ = uVar60;
    auVar170._12_4_ = uVar60;
    auVar11 = vfmadd231ps_fma(auVar119,(undefined1  [16])aVar2,auVar170);
    uVar60 = auVar243._0_4_;
    auVar171._4_4_ = uVar60;
    auVar171._0_4_ = uVar60;
    auVar171._8_4_ = uVar60;
    auVar171._12_4_ = uVar60;
    auVar243 = vfmadd231ps_fma(auVar132,(undefined1  [16])aVar2,auVar171);
    uVar60 = auVar65._0_4_;
    auVar172._4_4_ = uVar60;
    auVar172._0_4_ = uVar60;
    auVar172._8_4_ = uVar60;
    auVar172._12_4_ = uVar60;
    auVar65 = vfmadd231ps_fma(auVar62,(undefined1  [16])aVar2,auVar172);
    uVar60 = auVar64._0_4_;
    auVar73._4_4_ = uVar60;
    auVar73._0_4_ = uVar60;
    auVar73._8_4_ = uVar60;
    auVar73._12_4_ = uVar60;
    auVar64 = vfmadd231ps_fma(auVar93,(undefined1  [16])aVar2,auVar73);
    uVar60 = auVar234._0_4_;
    auVar74._4_4_ = uVar60;
    auVar74._0_4_ = uVar60;
    auVar74._8_4_ = uVar60;
    auVar74._12_4_ = uVar60;
    auVar234 = vfmadd231ps_fma(auVar12,(undefined1  [16])aVar2,auVar74);
    local_488 = vmovlhps_avx(auVar94,auVar243);
    _local_518 = vmovlhps_avx(auVar10,auVar65);
    local_478 = vmovlhps_avx(auVar63,auVar64);
    _local_378 = vmovlhps_avx(auVar11,auVar234);
    auVar12 = vminps_avx(local_488,_local_518);
    auVar9 = vminps_avx(local_478,_local_378);
    auVar125 = vminps_avx(auVar12,auVar9);
    auVar12 = vmaxps_avx(local_488,_local_518);
    auVar9 = vmaxps_avx(local_478,_local_378);
    auVar12 = vmaxps_avx(auVar12,auVar9);
    auVar9 = vshufpd_avx(auVar125,auVar125,3);
    auVar125 = vminps_avx(auVar125,auVar9);
    auVar9 = vshufpd_avx(auVar12,auVar12,3);
    auVar9 = vmaxps_avx(auVar12,auVar9);
    auVar12 = vandps_avx(local_2f8,auVar125);
    auVar9 = vandps_avx(local_2f8,auVar9);
    auVar12 = vmaxps_avx(auVar12,auVar9);
    auVar9 = vmovshdup_avx(auVar12);
    auVar12 = vmaxss_avx(auVar9,auVar12);
    local_1b8 = auVar12._0_4_ * 9.536743e-07;
    local_4b8._8_8_ = auVar94._0_8_;
    local_4b8._0_8_ = auVar94._0_8_;
    auVar204 = ZEXT1664(local_4b8);
    local_3b8._8_8_ = auVar10._0_8_;
    local_3b8._0_8_ = auVar10._0_8_;
    local_3c8._8_8_ = auVar63._0_8_;
    local_3c8._0_8_ = auVar63._0_8_;
    local_3d8._8_8_ = auVar11._0_8_;
    local_3d8._0_8_ = auVar11._0_8_;
    register0x00001308 = auVar243._0_8_;
    local_3e8 = auVar243._0_8_;
    auVar141 = ZEXT1664(_local_3e8);
    local_4c8._8_8_ = auVar65._0_8_;
    local_4c8._0_8_ = auVar65._0_8_;
    auVar178 = ZEXT1664(local_4c8);
    local_4d8._0_8_ = auVar64._0_8_;
    local_4d8._8_8_ = local_4d8._0_8_;
    auVar230 = ZEXT1664(local_4d8);
    local_4e8._8_8_ = auVar234._0_8_;
    local_4e8._0_8_ = auVar234._0_8_;
    auVar239 = ZEXT1664(local_4e8);
    local_388 = ZEXT416((uint)local_1b8);
    fStack_1b4 = local_1b8;
    fStack_1b0 = local_1b8;
    fStack_1ac = local_1b8;
    fStack_1a8 = local_1b8;
    fStack_1a4 = local_1b8;
    fStack_1a0 = local_1b8;
    fStack_19c = local_1b8;
    local_1d8 = (uint)local_1b8 ^ local_3f8;
    uStack_1d4 = local_1d8;
    uStack_1d0 = local_1d8;
    uStack_1cc = local_1d8;
    uStack_1c8 = local_1d8;
    uStack_1c4 = local_1d8;
    uStack_1c0 = local_1d8;
    uStack_1bc = local_1d8;
    uVar55 = 0;
    local_208 = vsubps_avx(_local_518,local_488);
    local_218 = vsubps_avx(local_478,_local_518);
    local_228 = vsubps_avx(_local_378,local_478);
    auVar216 = ZEXT1664(local_3d8);
    auVar191 = ZEXT1664(local_3c8);
    auVar161 = ZEXT1664(local_3b8);
    local_248 = vsubps_avx(_local_418,local_408);
    local_258 = vsubps_avx(_local_458,local_438);
    local_268 = vsubps_avx(_local_468,local_448);
    auVar43._4_4_ = fStack_494;
    auVar43._0_4_ = local_498;
    auVar43._8_4_ = fStack_490;
    auVar43._12_4_ = fStack_48c;
    _local_278 = vsubps_avx(auVar43,local_428);
    auVar250 = ZEXT1664(ZEXT816(0x3f80000000000000));
    auVar261 = ZEXT1664(ZEXT816(0x3f80000000000000));
LAB_015a3cc7:
    auVar132 = auVar250._0_16_;
    local_238 = auVar261._0_16_;
    auVar12 = vshufps_avx(auVar132,auVar132,0x50);
    auVar269._8_4_ = 0x3f800000;
    auVar269._0_8_ = 0x3f8000003f800000;
    auVar269._12_4_ = 0x3f800000;
    auVar272._16_4_ = 0x3f800000;
    auVar272._0_16_ = auVar269;
    auVar272._20_4_ = 0x3f800000;
    auVar272._24_4_ = 0x3f800000;
    auVar272._28_4_ = 0x3f800000;
    auVar9 = vsubps_avx(auVar269,auVar12);
    fVar58 = auVar12._0_4_;
    auVar75._0_4_ = auVar141._0_4_ * fVar58;
    fVar90 = auVar12._4_4_;
    auVar75._4_4_ = auVar141._4_4_ * fVar90;
    fVar118 = auVar12._8_4_;
    auVar75._8_4_ = auVar141._8_4_ * fVar118;
    fVar91 = auVar12._12_4_;
    auVar75._12_4_ = auVar141._12_4_ * fVar91;
    auVar173._0_4_ = auVar178._0_4_ * fVar58;
    auVar173._4_4_ = auVar178._4_4_ * fVar90;
    auVar173._8_4_ = auVar178._8_4_ * fVar118;
    auVar173._12_4_ = auVar178._12_4_ * fVar91;
    auVar135._0_4_ = auVar230._0_4_ * fVar58;
    auVar135._4_4_ = auVar230._4_4_ * fVar90;
    auVar135._8_4_ = auVar230._8_4_ * fVar118;
    auVar135._12_4_ = auVar230._12_4_ * fVar91;
    auVar109._0_4_ = auVar239._0_4_ * fVar58;
    auVar109._4_4_ = auVar239._4_4_ * fVar90;
    auVar109._8_4_ = auVar239._8_4_ * fVar118;
    auVar109._12_4_ = auVar239._12_4_ * fVar91;
    auVar11 = vfmadd231ps_fma(auVar75,auVar9,auVar204._0_16_);
    auVar243 = vfmadd231ps_fma(auVar173,auVar9,auVar161._0_16_);
    auVar65 = vfmadd231ps_fma(auVar135,auVar9,auVar191._0_16_);
    auVar64 = vfmadd231ps_fma(auVar109,auVar216._0_16_,auVar9);
    auVar12 = vmovshdup_avx(auVar261._0_16_);
    fVar58 = auVar261._0_4_;
    fStack_100 = (auVar12._0_4_ - fVar58) * 0.04761905;
    auVar215._4_4_ = fVar58;
    auVar215._0_4_ = fVar58;
    auVar215._8_4_ = fVar58;
    auVar215._12_4_ = fVar58;
    auVar215._16_4_ = fVar58;
    auVar215._20_4_ = fVar58;
    auVar215._24_4_ = fVar58;
    auVar215._28_4_ = fVar58;
    auVar106._0_8_ = auVar12._0_8_;
    auVar106._8_8_ = auVar106._0_8_;
    auVar106._16_8_ = auVar106._0_8_;
    auVar106._24_8_ = auVar106._0_8_;
    auVar87 = vsubps_avx(auVar106,auVar215);
    uVar60 = auVar11._0_4_;
    auVar267._4_4_ = uVar60;
    auVar267._0_4_ = uVar60;
    auVar267._8_4_ = uVar60;
    auVar267._12_4_ = uVar60;
    auVar267._16_4_ = uVar60;
    auVar267._20_4_ = uVar60;
    auVar267._24_4_ = uVar60;
    auVar267._28_4_ = uVar60;
    auVar12 = vmovshdup_avx(auVar11);
    uVar92 = auVar12._0_8_;
    auVar260._8_8_ = uVar92;
    auVar260._0_8_ = uVar92;
    auVar260._16_8_ = uVar92;
    auVar260._24_8_ = uVar92;
    fVar179 = auVar243._0_4_;
    auVar247._4_4_ = fVar179;
    auVar247._0_4_ = fVar179;
    auVar247._8_4_ = fVar179;
    auVar247._12_4_ = fVar179;
    auVar247._16_4_ = fVar179;
    auVar247._20_4_ = fVar179;
    auVar247._24_4_ = fVar179;
    auVar247._28_4_ = fVar179;
    auVar9 = vmovshdup_avx(auVar243);
    auVar107._0_8_ = auVar9._0_8_;
    auVar107._8_8_ = auVar107._0_8_;
    auVar107._16_8_ = auVar107._0_8_;
    auVar107._24_8_ = auVar107._0_8_;
    fVar217 = auVar65._0_4_;
    auVar188._4_4_ = fVar217;
    auVar188._0_4_ = fVar217;
    auVar188._8_4_ = fVar217;
    auVar188._12_4_ = fVar217;
    auVar188._16_4_ = fVar217;
    auVar188._20_4_ = fVar217;
    auVar188._24_4_ = fVar217;
    auVar188._28_4_ = fVar217;
    auVar125 = vmovshdup_avx(auVar65);
    auVar202._0_8_ = auVar125._0_8_;
    auVar202._8_8_ = auVar202._0_8_;
    auVar202._16_8_ = auVar202._0_8_;
    auVar202._24_8_ = auVar202._0_8_;
    fVar143 = auVar64._0_4_;
    auVar10 = vmovshdup_avx(auVar64);
    auVar234 = vfmadd132ps_fma(auVar87,auVar215,_DAT_01faff20);
    auVar87 = vsubps_avx(auVar272,ZEXT1632(auVar234));
    fVar58 = auVar234._0_4_;
    fVar90 = auVar234._4_4_;
    auVar13._4_4_ = fVar179 * fVar90;
    auVar13._0_4_ = fVar179 * fVar58;
    fVar118 = auVar234._8_4_;
    auVar13._8_4_ = fVar179 * fVar118;
    fVar91 = auVar234._12_4_;
    auVar13._12_4_ = fVar179 * fVar91;
    auVar13._16_4_ = fVar179 * 0.0;
    auVar13._20_4_ = fVar179 * 0.0;
    auVar13._24_4_ = fVar179 * 0.0;
    auVar13._28_4_ = 0x3f800000;
    auVar234 = vfmadd231ps_fma(auVar13,auVar87,auVar267);
    fVar59 = auVar9._0_4_;
    fVar61 = auVar9._4_4_;
    auVar14._4_4_ = fVar61 * fVar90;
    auVar14._0_4_ = fVar59 * fVar58;
    auVar14._8_4_ = fVar59 * fVar118;
    auVar14._12_4_ = fVar61 * fVar91;
    auVar14._16_4_ = fVar59 * 0.0;
    auVar14._20_4_ = fVar61 * 0.0;
    auVar14._24_4_ = fVar59 * 0.0;
    auVar14._28_4_ = uVar60;
    auVar94 = vfmadd231ps_fma(auVar14,auVar87,auVar260);
    auVar15._4_4_ = fVar217 * fVar90;
    auVar15._0_4_ = fVar217 * fVar58;
    auVar15._8_4_ = fVar217 * fVar118;
    auVar15._12_4_ = fVar217 * fVar91;
    auVar15._16_4_ = fVar217 * 0.0;
    auVar15._20_4_ = fVar217 * 0.0;
    auVar15._24_4_ = fVar217 * 0.0;
    auVar15._28_4_ = auVar12._4_4_;
    auVar63 = vfmadd231ps_fma(auVar15,auVar87,auVar247);
    fVar59 = auVar125._0_4_;
    fVar61 = auVar125._4_4_;
    auVar8._4_4_ = fVar61 * fVar90;
    auVar8._0_4_ = fVar59 * fVar58;
    auVar8._8_4_ = fVar59 * fVar118;
    auVar8._12_4_ = fVar61 * fVar91;
    auVar8._16_4_ = fVar59 * 0.0;
    auVar8._20_4_ = fVar61 * 0.0;
    auVar8._24_4_ = fVar59 * 0.0;
    auVar8._28_4_ = fVar179;
    auVar122 = vfmadd231ps_fma(auVar8,auVar87,auVar107);
    auVar12 = vshufps_avx(auVar11,auVar11,0xaa);
    local_3a8._8_8_ = auVar12._0_8_;
    local_3a8._0_8_ = local_3a8._8_8_;
    local_3a8._16_8_ = local_3a8._8_8_;
    local_3a8._24_8_ = local_3a8._8_8_;
    auVar9 = vshufps_avx(auVar11,auVar11,0xff);
    uStack_500 = auVar9._0_8_;
    local_508 = (undefined1  [8])uStack_500;
    uStack_4f8 = uStack_500;
    uStack_4f0 = uStack_500;
    auVar16._4_4_ = fVar143 * fVar90;
    auVar16._0_4_ = fVar143 * fVar58;
    auVar16._8_4_ = fVar143 * fVar118;
    auVar16._12_4_ = fVar143 * fVar91;
    auVar16._16_4_ = fVar143 * 0.0;
    auVar16._20_4_ = fVar143 * 0.0;
    auVar16._24_4_ = fVar143 * 0.0;
    auVar16._28_4_ = fVar143;
    auVar11 = vfmadd231ps_fma(auVar16,auVar87,auVar188);
    auVar9 = vshufps_avx(auVar243,auVar243,0xaa);
    auVar189._0_8_ = auVar9._0_8_;
    auVar189._8_8_ = auVar189._0_8_;
    auVar189._16_8_ = auVar189._0_8_;
    auVar189._24_8_ = auVar189._0_8_;
    auVar125 = vshufps_avx(auVar243,auVar243,0xff);
    local_318._8_8_ = auVar125._0_8_;
    local_318._0_8_ = local_318._8_8_;
    local_318._16_8_ = local_318._8_8_;
    local_318._24_8_ = local_318._8_8_;
    fVar59 = auVar10._0_4_;
    fVar61 = auVar10._4_4_;
    auVar18._4_4_ = fVar61 * fVar90;
    auVar18._0_4_ = fVar59 * fVar58;
    auVar18._8_4_ = fVar59 * fVar118;
    auVar18._12_4_ = fVar61 * fVar91;
    auVar18._16_4_ = fVar59 * 0.0;
    auVar18._20_4_ = fVar61 * 0.0;
    auVar18._24_4_ = fVar59 * 0.0;
    auVar18._28_4_ = auVar12._4_4_;
    auVar119 = vfmadd231ps_fma(auVar18,auVar87,auVar202);
    auVar249._28_4_ = fVar61;
    auVar249._0_28_ =
         ZEXT1628(CONCAT412(auVar63._12_4_ * fVar91,
                            CONCAT48(auVar63._8_4_ * fVar118,
                                     CONCAT44(auVar63._4_4_ * fVar90,auVar63._0_4_ * fVar58))));
    auVar234 = vfmadd231ps_fma(auVar249,auVar87,ZEXT1632(auVar234));
    fVar59 = auVar125._4_4_;
    auVar19._28_4_ = fVar59;
    auVar19._0_28_ =
         ZEXT1628(CONCAT412(auVar122._12_4_ * fVar91,
                            CONCAT48(auVar122._8_4_ * fVar118,
                                     CONCAT44(auVar122._4_4_ * fVar90,auVar122._0_4_ * fVar58))));
    auVar94 = vfmadd231ps_fma(auVar19,auVar87,ZEXT1632(auVar94));
    auVar12 = vshufps_avx(auVar65,auVar65,0xaa);
    uVar92 = auVar12._0_8_;
    auVar177._8_8_ = uVar92;
    auVar177._0_8_ = uVar92;
    auVar177._16_8_ = uVar92;
    auVar177._24_8_ = uVar92;
    auVar10 = vshufps_avx(auVar65,auVar65,0xff);
    uVar92 = auVar10._0_8_;
    auVar273._8_8_ = uVar92;
    auVar273._0_8_ = uVar92;
    auVar273._16_8_ = uVar92;
    auVar273._24_8_ = uVar92;
    auVar65 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar11._12_4_ * fVar91,
                                                 CONCAT48(auVar11._8_4_ * fVar118,
                                                          CONCAT44(auVar11._4_4_ * fVar90,
                                                                   auVar11._0_4_ * fVar58)))),
                              auVar87,ZEXT1632(auVar63));
    auVar11 = vshufps_avx(auVar64,auVar64,0xaa);
    auVar243 = vshufps_avx(auVar64,auVar64,0xff);
    auVar64 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar91 * auVar119._12_4_,
                                                 CONCAT48(fVar118 * auVar119._8_4_,
                                                          CONCAT44(fVar90 * auVar119._4_4_,
                                                                   fVar58 * auVar119._0_4_)))),
                              auVar87,ZEXT1632(auVar122));
    auVar63 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar91 * auVar65._12_4_,
                                                 CONCAT48(fVar118 * auVar65._8_4_,
                                                          CONCAT44(fVar90 * auVar65._4_4_,
                                                                   fVar58 * auVar65._0_4_)))),
                              auVar87,ZEXT1632(auVar234));
    auVar13 = vsubps_avx(ZEXT1632(auVar65),ZEXT1632(auVar234));
    auVar65 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar91 * auVar64._12_4_,
                                                 CONCAT48(fVar118 * auVar64._8_4_,
                                                          CONCAT44(fVar90 * auVar64._4_4_,
                                                                   fVar58 * auVar64._0_4_)))),
                              auVar87,ZEXT1632(auVar94));
    auVar14 = vsubps_avx(ZEXT1632(auVar64),ZEXT1632(auVar94));
    fStack_2cc = auVar14._28_4_;
    auVar248._0_4_ = fStack_100 * auVar13._0_4_ * 3.0;
    auVar248._4_4_ = fStack_100 * auVar13._4_4_ * 3.0;
    auVar248._8_4_ = fStack_100 * auVar13._8_4_ * 3.0;
    auVar248._12_4_ = fStack_100 * auVar13._12_4_ * 3.0;
    auVar248._16_4_ = fStack_100 * auVar13._16_4_ * 3.0;
    auVar248._20_4_ = fStack_100 * auVar13._20_4_ * 3.0;
    auVar248._24_4_ = fStack_100 * auVar13._24_4_ * 3.0;
    auVar248._28_4_ = 0;
    local_2e8._0_4_ = fStack_100 * auVar14._0_4_ * 3.0;
    local_2e8._4_4_ = fStack_100 * auVar14._4_4_ * 3.0;
    fStack_2e0 = fStack_100 * auVar14._8_4_ * 3.0;
    fStack_2dc = fStack_100 * auVar14._12_4_ * 3.0;
    fStack_2d8 = fStack_100 * auVar14._16_4_ * 3.0;
    fStack_2d4 = fStack_100 * auVar14._20_4_ * 3.0;
    fStack_2d0 = fStack_100 * auVar14._24_4_ * 3.0;
    fVar61 = auVar9._0_4_;
    fVar143 = auVar9._4_4_;
    auVar20._4_4_ = fVar143 * fVar90;
    auVar20._0_4_ = fVar61 * fVar58;
    auVar20._8_4_ = fVar61 * fVar118;
    auVar20._12_4_ = fVar143 * fVar91;
    auVar20._16_4_ = fVar61 * 0.0;
    auVar20._20_4_ = fVar143 * 0.0;
    auVar20._24_4_ = fVar61 * 0.0;
    auVar20._28_4_ = fStack_2cc;
    auVar9 = vfmadd231ps_fma(auVar20,auVar87,local_3a8);
    fVar61 = auVar125._0_4_;
    auVar21._4_4_ = fVar59 * fVar90;
    auVar21._0_4_ = fVar61 * fVar58;
    auVar21._8_4_ = fVar61 * fVar118;
    auVar21._12_4_ = fVar59 * fVar91;
    auVar21._16_4_ = fVar61 * 0.0;
    auVar21._20_4_ = fVar59 * 0.0;
    auVar21._24_4_ = fVar61 * 0.0;
    auVar21._28_4_ = 0;
    auVar125 = vfmadd231ps_fma(auVar21,auVar87,_local_508);
    fVar59 = auVar12._0_4_;
    fVar61 = auVar12._4_4_;
    auVar22._4_4_ = fVar61 * fVar90;
    auVar22._0_4_ = fVar59 * fVar58;
    auVar22._8_4_ = fVar59 * fVar118;
    auVar22._12_4_ = fVar61 * fVar91;
    auVar22._16_4_ = fVar59 * 0.0;
    auVar22._20_4_ = fVar61 * 0.0;
    auVar22._24_4_ = fVar59 * 0.0;
    auVar22._28_4_ = auVar13._28_4_;
    auVar12 = vfmadd231ps_fma(auVar22,auVar87,auVar189);
    fVar59 = auVar10._0_4_;
    fVar217 = auVar10._4_4_;
    auVar23._4_4_ = fVar217 * fVar90;
    auVar23._0_4_ = fVar59 * fVar58;
    auVar23._8_4_ = fVar59 * fVar118;
    auVar23._12_4_ = fVar217 * fVar91;
    auVar23._16_4_ = fVar59 * 0.0;
    auVar23._20_4_ = fVar217 * 0.0;
    auVar23._24_4_ = fVar59 * 0.0;
    auVar23._28_4_ = fVar143;
    auVar10 = vfmadd231ps_fma(auVar23,auVar87,local_318);
    local_318 = vpermps_avx2(_DAT_01fec480,ZEXT1632(auVar63));
    fVar59 = auVar11._0_4_;
    fVar61 = auVar11._4_4_;
    auVar24._4_4_ = fVar61 * fVar90;
    auVar24._0_4_ = fVar59 * fVar58;
    auVar24._8_4_ = fVar59 * fVar118;
    auVar24._12_4_ = fVar61 * fVar91;
    auVar24._16_4_ = fVar59 * 0.0;
    auVar24._20_4_ = fVar61 * 0.0;
    auVar24._24_4_ = fVar59 * 0.0;
    auVar24._28_4_ = fVar61;
    auVar11 = vfmadd231ps_fma(auVar24,auVar87,auVar177);
    _local_508 = vpermps_avx2(_DAT_01fec480,ZEXT1632(auVar65));
    auVar18 = _local_508;
    fVar59 = auVar243._0_4_;
    fVar61 = auVar243._4_4_;
    auVar25._4_4_ = fVar61 * fVar90;
    auVar25._0_4_ = fVar59 * fVar58;
    auVar25._8_4_ = fVar59 * fVar118;
    auVar25._12_4_ = fVar61 * fVar91;
    auVar25._16_4_ = fVar59 * 0.0;
    auVar25._20_4_ = fVar61 * 0.0;
    auVar25._24_4_ = fVar59 * 0.0;
    auVar25._28_4_ = fVar61;
    auVar243 = vfmadd231ps_fma(auVar25,auVar87,auVar273);
    auVar26._28_4_ = fVar217;
    auVar26._0_28_ =
         ZEXT1628(CONCAT412(auVar12._12_4_ * fVar91,
                            CONCAT48(auVar12._8_4_ * fVar118,
                                     CONCAT44(auVar12._4_4_ * fVar90,auVar12._0_4_ * fVar58))));
    auVar9 = vfmadd231ps_fma(auVar26,auVar87,ZEXT1632(auVar9));
    auVar125 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar91 * auVar10._12_4_,
                                                  CONCAT48(fVar118 * auVar10._8_4_,
                                                           CONCAT44(fVar90 * auVar10._4_4_,
                                                                    fVar58 * auVar10._0_4_)))),
                               auVar87,ZEXT1632(auVar125));
    local_3a8._0_4_ = auVar63._0_4_ + auVar248._0_4_;
    local_3a8._4_4_ = auVar63._4_4_ + auVar248._4_4_;
    local_3a8._8_4_ = auVar63._8_4_ + auVar248._8_4_;
    local_3a8._12_4_ = auVar63._12_4_ + auVar248._12_4_;
    local_3a8._16_4_ = auVar248._16_4_ + 0.0;
    local_3a8._20_4_ = auVar248._20_4_ + 0.0;
    local_3a8._24_4_ = auVar248._24_4_ + 0.0;
    local_3a8._28_4_ = 0;
    auVar12 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar11._12_4_ * fVar91,
                                                 CONCAT48(auVar11._8_4_ * fVar118,
                                                          CONCAT44(auVar11._4_4_ * fVar90,
                                                                   auVar11._0_4_ * fVar58)))),
                              auVar87,ZEXT1632(auVar12));
    auVar10 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar243._12_4_ * fVar91,
                                                 CONCAT48(auVar243._8_4_ * fVar118,
                                                          CONCAT44(auVar243._4_4_ * fVar90,
                                                                   auVar243._0_4_ * fVar58)))),
                              auVar87,ZEXT1632(auVar10));
    auVar11 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar91 * auVar12._12_4_,
                                                 CONCAT48(fVar118 * auVar12._8_4_,
                                                          CONCAT44(fVar90 * auVar12._4_4_,
                                                                   fVar58 * auVar12._0_4_)))),
                              auVar87,ZEXT1632(auVar9));
    auVar243 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar10._12_4_ * fVar91,
                                                  CONCAT48(auVar10._8_4_ * fVar118,
                                                           CONCAT44(auVar10._4_4_ * fVar90,
                                                                    auVar10._0_4_ * fVar58)))),
                               ZEXT1632(auVar125),auVar87);
    auVar87 = vsubps_avx(ZEXT1632(auVar12),ZEXT1632(auVar9));
    auVar13 = vsubps_avx(ZEXT1632(auVar10),ZEXT1632(auVar125));
    auVar268._0_4_ = fStack_100 * auVar87._0_4_ * 3.0;
    auVar268._4_4_ = fStack_100 * auVar87._4_4_ * 3.0;
    auVar268._8_4_ = fStack_100 * auVar87._8_4_ * 3.0;
    auVar268._12_4_ = fStack_100 * auVar87._12_4_ * 3.0;
    auVar268._16_4_ = fStack_100 * auVar87._16_4_ * 3.0;
    auVar268._20_4_ = fStack_100 * auVar87._20_4_ * 3.0;
    auVar268._24_4_ = fStack_100 * auVar87._24_4_ * 3.0;
    auVar268._28_4_ = 0;
    local_118 = fStack_100 * auVar13._0_4_ * 3.0;
    fStack_114 = fStack_100 * auVar13._4_4_ * 3.0;
    auVar27._4_4_ = fStack_114;
    auVar27._0_4_ = local_118;
    fStack_110 = fStack_100 * auVar13._8_4_ * 3.0;
    auVar27._8_4_ = fStack_110;
    fStack_10c = fStack_100 * auVar13._12_4_ * 3.0;
    auVar27._12_4_ = fStack_10c;
    fStack_108 = fStack_100 * auVar13._16_4_ * 3.0;
    auVar27._16_4_ = fStack_108;
    fStack_104 = fStack_100 * auVar13._20_4_ * 3.0;
    auVar27._20_4_ = fStack_104;
    fStack_100 = fStack_100 * auVar13._24_4_ * 3.0;
    auVar27._24_4_ = fStack_100;
    auVar27._28_4_ = 0x40400000;
    _local_338 = vpermps_avx2(_DAT_01fec480,ZEXT1632(auVar11));
    local_1f8 = vpermps_avx2(_DAT_01fec480,ZEXT1632(auVar243));
    auVar87 = vsubps_avx(ZEXT1632(auVar11),ZEXT1632(auVar63));
    auVar13 = vsubps_avx(ZEXT1632(auVar243),ZEXT1632(auVar65));
    auVar14 = vsubps_avx(_local_338,local_318);
    fVar179 = auVar87._0_4_ + auVar14._0_4_;
    fVar192 = auVar87._4_4_ + auVar14._4_4_;
    fVar193 = auVar87._8_4_ + auVar14._8_4_;
    fVar194 = auVar87._12_4_ + auVar14._12_4_;
    fVar142 = auVar87._16_4_ + auVar14._16_4_;
    fVar162 = auVar87._20_4_ + auVar14._20_4_;
    fVar163 = auVar87._24_4_ + auVar14._24_4_;
    auVar15 = vsubps_avx(local_1f8,_local_508);
    auVar88._0_4_ = auVar13._0_4_ + auVar15._0_4_;
    auVar88._4_4_ = auVar13._4_4_ + auVar15._4_4_;
    auVar88._8_4_ = auVar13._8_4_ + auVar15._8_4_;
    auVar88._12_4_ = auVar13._12_4_ + auVar15._12_4_;
    auVar88._16_4_ = auVar13._16_4_ + auVar15._16_4_;
    auVar88._20_4_ = auVar13._20_4_ + auVar15._20_4_;
    auVar88._24_4_ = auVar13._24_4_ + auVar15._24_4_;
    auVar88._28_4_ = auVar13._28_4_ + auVar15._28_4_;
    local_b8 = ZEXT1632(auVar65);
    fVar58 = auVar65._0_4_;
    local_138 = (float)local_2e8._0_4_ + fVar58;
    fVar90 = auVar65._4_4_;
    fStack_134 = (float)local_2e8._4_4_ + fVar90;
    fVar118 = auVar65._8_4_;
    fStack_130 = fStack_2e0 + fVar118;
    fVar91 = auVar65._12_4_;
    fStack_12c = fStack_2dc + fVar91;
    fStack_128 = fStack_2d8 + 0.0;
    fStack_124 = fStack_2d4 + 0.0;
    fStack_120 = fStack_2d0 + 0.0;
    local_78 = ZEXT1632(auVar63);
    auVar13 = vsubps_avx(local_78,auVar248);
    local_98 = vpermps_avx2(_DAT_01fec480,auVar13);
    auVar13 = vsubps_avx(local_b8,_local_2e8);
    local_158 = vpermps_avx2(_DAT_01fec480,auVar13);
    local_d8._0_4_ = auVar11._0_4_ + auVar268._0_4_;
    local_d8._4_4_ = auVar11._4_4_ + auVar268._4_4_;
    local_d8._8_4_ = auVar11._8_4_ + auVar268._8_4_;
    local_d8._12_4_ = auVar11._12_4_ + auVar268._12_4_;
    local_d8._16_4_ = auVar268._16_4_ + 0.0;
    local_d8._20_4_ = auVar268._20_4_ + 0.0;
    local_d8._24_4_ = auVar268._24_4_ + 0.0;
    local_d8._28_4_ = 0;
    auVar141 = ZEXT3264(local_d8);
    auVar249 = ZEXT1632(auVar11);
    auVar13 = vsubps_avx(auVar249,auVar268);
    auVar16 = vpermps_avx2(_DAT_01fec480,auVar13);
    fVar59 = auVar243._0_4_;
    local_118 = fVar59 + local_118;
    fVar61 = auVar243._4_4_;
    fStack_114 = fVar61 + fStack_114;
    fVar143 = auVar243._8_4_;
    fStack_110 = fVar143 + fStack_110;
    fVar217 = auVar243._12_4_;
    fStack_10c = fVar217 + fStack_10c;
    fStack_108 = fStack_108 + 0.0;
    fStack_104 = fStack_104 + 0.0;
    fStack_100 = fStack_100 + 0.0;
    auVar13 = vsubps_avx(ZEXT1632(auVar243),auVar27);
    local_f8 = vpermps_avx2(_DAT_01fec480,auVar13);
    auVar28._4_4_ = fVar90 * fVar192;
    auVar28._0_4_ = fVar58 * fVar179;
    auVar28._8_4_ = fVar118 * fVar193;
    auVar28._12_4_ = fVar91 * fVar194;
    auVar28._16_4_ = fVar142 * 0.0;
    auVar28._20_4_ = fVar162 * 0.0;
    auVar28._24_4_ = fVar163 * 0.0;
    auVar28._28_4_ = auVar13._28_4_;
    auVar12 = vfnmadd231ps_fma(auVar28,local_78,auVar88);
    fStack_11c = fStack_2cc + 0.0;
    auVar29._4_4_ = fStack_134 * fVar192;
    auVar29._0_4_ = local_138 * fVar179;
    auVar29._8_4_ = fStack_130 * fVar193;
    auVar29._12_4_ = fStack_12c * fVar194;
    auVar29._16_4_ = fStack_128 * fVar142;
    auVar29._20_4_ = fStack_124 * fVar162;
    auVar29._24_4_ = fStack_120 * fVar163;
    auVar29._28_4_ = 0;
    auVar9 = vfnmadd231ps_fma(auVar29,auVar88,local_3a8);
    auVar30._4_4_ = local_158._4_4_ * fVar192;
    auVar30._0_4_ = local_158._0_4_ * fVar179;
    auVar30._8_4_ = local_158._8_4_ * fVar193;
    auVar30._12_4_ = local_158._12_4_ * fVar194;
    auVar30._16_4_ = local_158._16_4_ * fVar142;
    auVar30._20_4_ = local_158._20_4_ * fVar162;
    auVar30._24_4_ = local_158._24_4_ * fVar163;
    auVar30._28_4_ = fStack_2cc + 0.0;
    auVar125 = vfnmadd231ps_fma(auVar30,local_98,auVar88);
    auVar31._4_4_ = (float)local_508._4_4_ * fVar192;
    auVar31._0_4_ = (float)local_508._0_4_ * fVar179;
    auVar31._8_4_ = (float)uStack_500 * fVar193;
    auVar31._12_4_ = uStack_500._4_4_ * fVar194;
    auVar31._16_4_ = (float)uStack_4f8 * fVar142;
    auVar31._20_4_ = uStack_4f8._4_4_ * fVar162;
    auVar31._24_4_ = (float)uStack_4f0 * fVar163;
    auVar31._28_4_ = uStack_4f0._4_4_;
    auVar10 = vfnmadd231ps_fma(auVar31,local_318,auVar88);
    auVar203._0_4_ = fVar59 * fVar179;
    auVar203._4_4_ = fVar61 * fVar192;
    auVar203._8_4_ = fVar143 * fVar193;
    auVar203._12_4_ = fVar217 * fVar194;
    auVar203._16_4_ = fVar142 * 0.0;
    auVar203._20_4_ = fVar162 * 0.0;
    auVar203._24_4_ = fVar163 * 0.0;
    auVar203._28_4_ = 0;
    auVar11 = vfnmadd231ps_fma(auVar203,auVar249,auVar88);
    uStack_fc = 0x40400000;
    auVar32._4_4_ = fStack_114 * fVar192;
    auVar32._0_4_ = local_118 * fVar179;
    auVar32._8_4_ = fStack_110 * fVar193;
    auVar32._12_4_ = fStack_10c * fVar194;
    auVar32._16_4_ = fStack_108 * fVar142;
    auVar32._20_4_ = fStack_104 * fVar162;
    auVar32._24_4_ = fStack_100 * fVar163;
    auVar32._28_4_ = local_318._28_4_;
    auVar65 = vfnmadd231ps_fma(auVar32,local_d8,auVar88);
    auVar33._4_4_ = local_f8._4_4_ * fVar192;
    auVar33._0_4_ = local_f8._0_4_ * fVar179;
    auVar33._8_4_ = local_f8._8_4_ * fVar193;
    auVar33._12_4_ = local_f8._12_4_ * fVar194;
    auVar33._16_4_ = local_f8._16_4_ * fVar142;
    auVar33._20_4_ = local_f8._20_4_ * fVar162;
    auVar33._24_4_ = local_f8._24_4_ * fVar163;
    auVar33._28_4_ = local_f8._28_4_;
    _local_2e8 = auVar16;
    auVar64 = vfnmadd231ps_fma(auVar33,auVar16,auVar88);
    auVar34._4_4_ = local_1f8._4_4_ * fVar192;
    auVar34._0_4_ = local_1f8._0_4_ * fVar179;
    auVar34._8_4_ = local_1f8._8_4_ * fVar193;
    auVar34._12_4_ = local_1f8._12_4_ * fVar194;
    auVar34._16_4_ = local_1f8._16_4_ * fVar142;
    auVar34._20_4_ = local_1f8._20_4_ * fVar162;
    auVar34._24_4_ = local_1f8._24_4_ * fVar163;
    auVar34._28_4_ = auVar87._28_4_ + auVar14._28_4_;
    auVar234 = vfnmadd231ps_fma(auVar34,_local_338,auVar88);
    auVar13 = vminps_avx(ZEXT1632(auVar12),ZEXT1632(auVar9));
    auVar87 = vmaxps_avx(ZEXT1632(auVar12),ZEXT1632(auVar9));
    auVar14 = vminps_avx(ZEXT1632(auVar125),ZEXT1632(auVar10));
    auVar14 = vminps_avx(auVar13,auVar14);
    auVar13 = vmaxps_avx(ZEXT1632(auVar125),ZEXT1632(auVar10));
    auVar87 = vmaxps_avx(auVar87,auVar13);
    auVar15 = vminps_avx(ZEXT1632(auVar11),ZEXT1632(auVar65));
    auVar13 = vmaxps_avx(ZEXT1632(auVar11),ZEXT1632(auVar65));
    auVar8 = vminps_avx(ZEXT1632(auVar64),ZEXT1632(auVar234));
    auVar15 = vminps_avx(auVar15,auVar8);
    auVar15 = vminps_avx(auVar14,auVar15);
    auVar14 = vmaxps_avx(ZEXT1632(auVar64),ZEXT1632(auVar234));
    auVar13 = vmaxps_avx(auVar13,auVar14);
    auVar13 = vmaxps_avx(auVar87,auVar13);
    auVar47._4_4_ = fStack_1b4;
    auVar47._0_4_ = local_1b8;
    auVar47._8_4_ = fStack_1b0;
    auVar47._12_4_ = fStack_1ac;
    auVar47._16_4_ = fStack_1a8;
    auVar47._20_4_ = fStack_1a4;
    auVar47._24_4_ = fStack_1a0;
    auVar47._28_4_ = fStack_19c;
    auVar87 = vcmpps_avx(auVar15,auVar47,2);
    auVar45._4_4_ = uStack_1d4;
    auVar45._0_4_ = local_1d8;
    auVar45._8_4_ = uStack_1d0;
    auVar45._12_4_ = uStack_1cc;
    auVar45._16_4_ = uStack_1c8;
    auVar45._20_4_ = uStack_1c4;
    auVar45._24_4_ = uStack_1c0;
    auVar45._28_4_ = uStack_1bc;
    auVar13 = vcmpps_avx(auVar13,auVar45,5);
    auVar87 = vandps_avx(auVar13,auVar87);
    auVar13 = local_178 & auVar87;
    if ((((((((auVar13 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar13 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar13 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar13 >> 0x7f,0) != '\0') ||
          (auVar13 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar13 >> 0xbf,0) != '\0') ||
        (auVar13 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar13[0x1f] < '\0')
    {
      auVar13 = vsubps_avx(local_318,local_78);
      auVar14 = vsubps_avx(_local_338,auVar249);
      fVar192 = auVar13._0_4_ + auVar14._0_4_;
      fVar193 = auVar13._4_4_ + auVar14._4_4_;
      fVar194 = auVar13._8_4_ + auVar14._8_4_;
      fVar142 = auVar13._12_4_ + auVar14._12_4_;
      fVar162 = auVar13._16_4_ + auVar14._16_4_;
      fVar163 = auVar13._20_4_ + auVar14._20_4_;
      fVar164 = auVar13._24_4_ + auVar14._24_4_;
      auVar15 = vsubps_avx(_local_508,local_b8);
      auVar8 = vsubps_avx(local_1f8,ZEXT1632(auVar243));
      auVar108._0_4_ = auVar15._0_4_ + auVar8._0_4_;
      auVar108._4_4_ = auVar15._4_4_ + auVar8._4_4_;
      auVar108._8_4_ = auVar15._8_4_ + auVar8._8_4_;
      auVar108._12_4_ = auVar15._12_4_ + auVar8._12_4_;
      auVar108._16_4_ = auVar15._16_4_ + auVar8._16_4_;
      auVar108._20_4_ = auVar15._20_4_ + auVar8._20_4_;
      auVar108._24_4_ = auVar15._24_4_ + auVar8._24_4_;
      fVar179 = auVar8._28_4_;
      auVar108._28_4_ = auVar15._28_4_ + fVar179;
      auVar35._4_4_ = fVar90 * fVar193;
      auVar35._0_4_ = fVar58 * fVar192;
      auVar35._8_4_ = fVar118 * fVar194;
      auVar35._12_4_ = fVar91 * fVar142;
      auVar35._16_4_ = fVar162 * 0.0;
      auVar35._20_4_ = fVar163 * 0.0;
      auVar35._24_4_ = fVar164 * 0.0;
      auVar35._28_4_ = local_338._28_4_;
      auVar11 = vfnmadd231ps_fma(auVar35,auVar108,local_78);
      auVar36._4_4_ = fVar193 * fStack_134;
      auVar36._0_4_ = fVar192 * local_138;
      auVar36._8_4_ = fVar194 * fStack_130;
      auVar36._12_4_ = fVar142 * fStack_12c;
      auVar36._16_4_ = fVar162 * fStack_128;
      auVar36._20_4_ = fVar163 * fStack_124;
      auVar36._24_4_ = fVar164 * fStack_120;
      auVar36._28_4_ = 0;
      auVar12 = vfnmadd213ps_fma(local_3a8,auVar108,auVar36);
      auVar37._4_4_ = fVar193 * local_158._4_4_;
      auVar37._0_4_ = fVar192 * local_158._0_4_;
      auVar37._8_4_ = fVar194 * local_158._8_4_;
      auVar37._12_4_ = fVar142 * local_158._12_4_;
      auVar37._16_4_ = fVar162 * local_158._16_4_;
      auVar37._20_4_ = fVar163 * local_158._20_4_;
      auVar37._24_4_ = fVar164 * local_158._24_4_;
      auVar37._28_4_ = 0;
      auVar9 = vfnmadd213ps_fma(local_98,auVar108,auVar37);
      auVar38._4_4_ = (float)local_508._4_4_ * fVar193;
      auVar38._0_4_ = (float)local_508._0_4_ * fVar192;
      auVar38._8_4_ = (float)uStack_500 * fVar194;
      auVar38._12_4_ = uStack_500._4_4_ * fVar142;
      auVar38._16_4_ = (float)uStack_4f8 * fVar162;
      auVar38._20_4_ = uStack_4f8._4_4_ * fVar163;
      auVar38._24_4_ = (float)uStack_4f0 * fVar164;
      auVar38._28_4_ = 0;
      auVar243 = vfnmadd231ps_fma(auVar38,auVar108,local_318);
      auVar129._0_4_ = fVar59 * fVar192;
      auVar129._4_4_ = fVar61 * fVar193;
      auVar129._8_4_ = fVar143 * fVar194;
      auVar129._12_4_ = fVar217 * fVar142;
      auVar129._16_4_ = fVar162 * 0.0;
      auVar129._20_4_ = fVar163 * 0.0;
      auVar129._24_4_ = fVar164 * 0.0;
      auVar129._28_4_ = 0;
      auVar65 = vfnmadd231ps_fma(auVar129,auVar108,auVar249);
      auVar39._4_4_ = fVar193 * fStack_114;
      auVar39._0_4_ = fVar192 * local_118;
      auVar39._8_4_ = fVar194 * fStack_110;
      auVar39._12_4_ = fVar142 * fStack_10c;
      auVar39._16_4_ = fVar162 * fStack_108;
      auVar39._20_4_ = fVar163 * fStack_104;
      auVar39._24_4_ = fVar164 * fStack_100;
      auVar39._28_4_ = fVar179;
      auVar125 = vfnmadd213ps_fma(local_d8,auVar108,auVar39);
      auVar40._4_4_ = fVar193 * local_f8._4_4_;
      auVar40._0_4_ = fVar192 * local_f8._0_4_;
      auVar40._8_4_ = fVar194 * local_f8._8_4_;
      auVar40._12_4_ = fVar142 * local_f8._12_4_;
      auVar40._16_4_ = fVar162 * local_f8._16_4_;
      auVar40._20_4_ = fVar163 * local_f8._20_4_;
      auVar40._24_4_ = fVar164 * local_f8._24_4_;
      auVar40._28_4_ = fVar179;
      auVar10 = vfnmadd213ps_fma(auVar16,auVar108,auVar40);
      auVar141 = ZEXT1664(auVar10);
      auVar41._4_4_ = local_1f8._4_4_ * fVar193;
      auVar41._0_4_ = local_1f8._0_4_ * fVar192;
      auVar41._8_4_ = local_1f8._8_4_ * fVar194;
      auVar41._12_4_ = local_1f8._12_4_ * fVar142;
      auVar41._16_4_ = local_1f8._16_4_ * fVar162;
      auVar41._20_4_ = local_1f8._20_4_ * fVar163;
      auVar41._24_4_ = local_1f8._24_4_ * fVar164;
      auVar41._28_4_ = auVar13._28_4_ + auVar14._28_4_;
      auVar64 = vfnmadd231ps_fma(auVar41,auVar108,_local_338);
      auVar14 = vminps_avx(ZEXT1632(auVar11),ZEXT1632(auVar12));
      auVar13 = vmaxps_avx(ZEXT1632(auVar11),ZEXT1632(auVar12));
      auVar15 = vminps_avx(ZEXT1632(auVar9),ZEXT1632(auVar243));
      auVar15 = vminps_avx(auVar14,auVar15);
      auVar14 = vmaxps_avx(ZEXT1632(auVar9),ZEXT1632(auVar243));
      auVar13 = vmaxps_avx(auVar13,auVar14);
      auVar8 = vminps_avx(ZEXT1632(auVar65),ZEXT1632(auVar125));
      auVar14 = vmaxps_avx(ZEXT1632(auVar65),ZEXT1632(auVar125));
      auVar16 = vminps_avx(ZEXT1632(auVar10),ZEXT1632(auVar64));
      auVar8 = vminps_avx(auVar8,auVar16);
      auVar8 = vminps_avx(auVar15,auVar8);
      auVar15 = vmaxps_avx(ZEXT1632(auVar10),ZEXT1632(auVar64));
      auVar14 = vmaxps_avx(auVar14,auVar15);
      auVar14 = vmaxps_avx(auVar13,auVar14);
      auVar48._4_4_ = fStack_1b4;
      auVar48._0_4_ = local_1b8;
      auVar48._8_4_ = fStack_1b0;
      auVar48._12_4_ = fStack_1ac;
      auVar48._16_4_ = fStack_1a8;
      auVar48._20_4_ = fStack_1a4;
      auVar48._24_4_ = fStack_1a0;
      auVar48._28_4_ = fStack_19c;
      auVar13 = vcmpps_avx(auVar8,auVar48,2);
      auVar46._4_4_ = uStack_1d4;
      auVar46._0_4_ = local_1d8;
      auVar46._8_4_ = uStack_1d0;
      auVar46._12_4_ = uStack_1cc;
      auVar46._16_4_ = uStack_1c8;
      auVar46._20_4_ = uStack_1c4;
      auVar46._24_4_ = uStack_1c0;
      auVar46._28_4_ = uStack_1bc;
      auVar14 = vcmpps_avx(auVar14,auVar46,5);
      auVar13 = vandps_avx(auVar14,auVar13);
      auVar87 = vandps_avx(auVar87,local_178);
      auVar14 = auVar87 & auVar13;
      if ((((((((auVar14 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar14 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar14 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar14 >> 0x7f,0) != '\0') ||
            (auVar14 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar14 >> 0xbf,0) != '\0') ||
          (auVar14 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar14[0x1f] < '\0') {
        auVar87 = vandps_avx(auVar13,auVar87);
        uVar54 = vmovmskps_avx(auVar87);
        if (uVar54 != 0) {
          uVar57 = (ulong)uVar55;
          auStack_2c8[uVar57] = uVar54 & 0xff;
          uVar92 = vmovlps_avx(local_238);
          *(undefined8 *)(&uStack_198 + uVar57 * 2) = uVar92;
          uVar50 = vmovlps_avx(auVar132);
          auStack_58[uVar57] = uVar50;
          uVar55 = uVar55 + 1;
        }
      }
    }
    _local_508 = auVar18;
    if (uVar55 != 0) {
      do {
        auVar239 = ZEXT1664(local_4e8);
        auVar230 = ZEXT1664(local_4d8);
        auVar204 = ZEXT1664(local_4b8);
        auVar178 = ZEXT1664(local_4c8);
        uVar57 = (ulong)(uVar55 - 1);
        uVar53 = auStack_2c8[uVar57];
        uVar54 = (&uStack_198)[uVar57 * 2];
        fVar58 = afStack_194[uVar57 * 2];
        iVar17 = 0;
        for (uVar50 = (ulong)uVar53; (uVar50 & 1) == 0; uVar50 = uVar50 >> 1 | 0x8000000000000000) {
          iVar17 = iVar17 + 1;
        }
        uVar53 = uVar53 - 1 & uVar53;
        if (uVar53 == 0) {
          uVar55 = uVar55 - 1;
        }
        auVar242._8_8_ = 0;
        auVar242._0_8_ = auStack_58[uVar57];
        auVar250 = ZEXT1664(auVar242);
        auStack_2c8[uVar57] = uVar53;
        fVar90 = (float)(iVar17 + 1) * 0.14285715;
        auVar12 = vfmadd231ss_fma(ZEXT416((uint)(fVar58 * (float)iVar17 * 0.14285715)),
                                  ZEXT416(uVar54),ZEXT416((uint)(1.0 - (float)iVar17 * 0.14285715)))
        ;
        auVar9 = vfmadd231ss_fma(ZEXT416((uint)(fVar58 * fVar90)),ZEXT416(uVar54),
                                 ZEXT416((uint)(1.0 - fVar90)));
        fVar90 = auVar9._0_4_;
        auVar190._0_4_ = auVar12._0_4_;
        fVar58 = fVar90 - auVar190._0_4_;
        if (0.16666667 <= fVar58) {
          auVar12 = vinsertps_avx(auVar12,auVar9,0x10);
          auVar261 = ZEXT1664(auVar12);
          auVar161 = ZEXT1664(local_3b8);
          auVar191 = ZEXT1664(local_3c8);
          auVar216 = ZEXT1664(local_3d8);
          auVar141 = ZEXT1664(_local_3e8);
          goto LAB_015a3cc7;
        }
        auVar125 = vshufps_avx(auVar242,auVar242,0x50);
        auVar96._8_4_ = 0x3f800000;
        auVar96._0_8_ = 0x3f8000003f800000;
        auVar96._12_4_ = 0x3f800000;
        auVar10 = vsubps_avx(auVar96,auVar125);
        fVar118 = auVar125._0_4_;
        auVar136._0_4_ = fVar118 * (float)local_3e8._0_4_;
        fVar91 = auVar125._4_4_;
        auVar136._4_4_ = fVar91 * (float)local_3e8._4_4_;
        fVar59 = auVar125._8_4_;
        auVar136._8_4_ = fVar59 * fStack_3e0;
        fVar61 = auVar125._12_4_;
        auVar136._12_4_ = fVar61 * fStack_3dc;
        auVar151._0_4_ = local_4c8._0_4_ * fVar118;
        auVar151._4_4_ = local_4c8._4_4_ * fVar91;
        auVar151._8_4_ = local_4c8._8_4_ * fVar59;
        auVar151._12_4_ = local_4c8._12_4_ * fVar61;
        auVar174._0_4_ = local_4d8._0_4_ * fVar118;
        auVar174._4_4_ = local_4d8._4_4_ * fVar91;
        auVar174._8_4_ = local_4d8._8_4_ * fVar59;
        auVar174._12_4_ = local_4d8._12_4_ * fVar61;
        auVar76._0_4_ = local_4e8._0_4_ * fVar118;
        auVar76._4_4_ = local_4e8._4_4_ * fVar91;
        auVar76._8_4_ = local_4e8._8_4_ * fVar59;
        auVar76._12_4_ = local_4e8._12_4_ * fVar61;
        auVar125 = vfmadd231ps_fma(auVar136,auVar10,local_4b8);
        auVar11 = vfmadd231ps_fma(auVar151,auVar10,local_3b8);
        auVar243 = vfmadd231ps_fma(auVar174,auVar10,local_3c8);
        auVar10 = vfmadd231ps_fma(auVar76,auVar10,local_3d8);
        auVar130._16_16_ = auVar125;
        auVar130._0_16_ = auVar125;
        auVar140._16_16_ = auVar11;
        auVar140._0_16_ = auVar11;
        auVar160._16_16_ = auVar243;
        auVar160._0_16_ = auVar243;
        _local_508 = auVar12;
        auVar190._4_4_ = auVar190._0_4_;
        auVar190._8_4_ = auVar190._0_4_;
        auVar190._12_4_ = auVar190._0_4_;
        local_3a8._0_16_ = auVar9;
        auVar190._20_4_ = fVar90;
        auVar190._16_4_ = fVar90;
        auVar190._24_4_ = fVar90;
        auVar190._28_4_ = fVar90;
        auVar87 = vsubps_avx(auVar140,auVar130);
        auVar11 = vfmadd213ps_fma(auVar87,auVar190,auVar130);
        auVar87 = vsubps_avx(auVar160,auVar140);
        auVar65 = vfmadd213ps_fma(auVar87,auVar190,auVar140);
        auVar125 = vsubps_avx(auVar10,auVar243);
        auVar89._16_16_ = auVar125;
        auVar89._0_16_ = auVar125;
        auVar125 = vfmadd213ps_fma(auVar89,auVar190,auVar160);
        auVar87 = vsubps_avx(ZEXT1632(auVar65),ZEXT1632(auVar11));
        auVar10 = vfmadd213ps_fma(auVar87,auVar190,ZEXT1632(auVar11));
        auVar87 = vsubps_avx(ZEXT1632(auVar125),ZEXT1632(auVar65));
        auVar125 = vfmadd213ps_fma(auVar87,auVar190,ZEXT1632(auVar65));
        auVar87 = vsubps_avx(ZEXT1632(auVar125),ZEXT1632(auVar10));
        auVar94 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar87,auVar190);
        fVar217 = auVar87._4_4_ * 3.0;
        local_318._0_4_ = fVar58;
        fVar118 = fVar58 * 0.33333334;
        auVar97._0_8_ =
             CONCAT44(auVar94._4_4_ + fVar118 * fVar217,
                      auVar94._0_4_ + fVar118 * auVar87._0_4_ * 3.0);
        auVar97._8_4_ = auVar94._8_4_ + fVar118 * auVar87._8_4_ * 3.0;
        auVar97._12_4_ = auVar94._12_4_ + fVar118 * auVar87._12_4_ * 3.0;
        auVar10 = vshufpd_avx(auVar94,auVar94,3);
        auVar11 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
        _local_338 = auVar10;
        auVar125 = vsubps_avx(auVar10,auVar94);
        auVar243 = vsubps_avx(auVar11,(undefined1  [16])0x0);
        auVar77._0_4_ = auVar125._0_4_ + auVar243._0_4_;
        auVar77._4_4_ = auVar125._4_4_ + auVar243._4_4_;
        auVar77._8_4_ = auVar125._8_4_ + auVar243._8_4_;
        auVar77._12_4_ = auVar125._12_4_ + auVar243._12_4_;
        auVar125 = vshufps_avx(auVar94,auVar94,0xb1);
        auVar243 = vshufps_avx(auVar97,auVar97,0xb1);
        auVar264._4_4_ = auVar77._0_4_;
        auVar264._0_4_ = auVar77._0_4_;
        auVar264._8_4_ = auVar77._0_4_;
        auVar264._12_4_ = auVar77._0_4_;
        auVar65 = vshufps_avx(auVar77,auVar77,0x55);
        fVar91 = auVar65._0_4_;
        auVar78._0_4_ = fVar91 * auVar125._0_4_;
        fVar59 = auVar65._4_4_;
        auVar78._4_4_ = fVar59 * auVar125._4_4_;
        fVar61 = auVar65._8_4_;
        auVar78._8_4_ = fVar61 * auVar125._8_4_;
        fVar143 = auVar65._12_4_;
        auVar78._12_4_ = fVar143 * auVar125._12_4_;
        auVar152._0_4_ = fVar91 * auVar243._0_4_;
        auVar152._4_4_ = fVar59 * auVar243._4_4_;
        auVar152._8_4_ = fVar61 * auVar243._8_4_;
        auVar152._12_4_ = fVar143 * auVar243._12_4_;
        auVar64 = vfmadd231ps_fma(auVar78,auVar264,auVar94);
        _local_2e8 = auVar97;
        auVar234 = vfmadd231ps_fma(auVar152,auVar264,auVar97);
        auVar243 = vshufps_avx(auVar64,auVar64,0xe8);
        auVar65 = vshufps_avx(auVar234,auVar234,0xe8);
        auVar125 = vcmpps_avx(auVar243,auVar65,1);
        uVar54 = vextractps_avx(auVar125,0);
        auVar63 = auVar234;
        if ((uVar54 & 1) == 0) {
          auVar63 = auVar64;
        }
        auVar121._0_4_ = fVar118 * auVar87._16_4_ * 3.0;
        auVar121._4_4_ = fVar118 * fVar217;
        auVar121._8_4_ = fVar118 * auVar87._24_4_ * 3.0;
        auVar121._12_4_ = fVar118 * auVar141._28_4_;
        local_1f8._0_16_ = vsubps_avx((undefined1  [16])0x0,auVar121);
        auVar122 = vshufps_avx(local_1f8._0_16_,local_1f8._0_16_,0xb1);
        auVar119 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
        auVar183._0_4_ = fVar91 * auVar122._0_4_;
        auVar183._4_4_ = fVar59 * auVar122._4_4_;
        auVar183._8_4_ = fVar61 * auVar122._8_4_;
        auVar183._12_4_ = fVar143 * auVar122._12_4_;
        auVar199._0_4_ = auVar119._0_4_ * fVar91;
        auVar199._4_4_ = auVar119._4_4_ * fVar59;
        auVar199._8_4_ = auVar119._8_4_ * fVar61;
        auVar199._12_4_ = auVar119._12_4_ * fVar143;
        auVar62 = vfmadd231ps_fma(auVar183,auVar264,local_1f8._0_16_);
        auVar93 = vfmadd231ps_fma(auVar199,(undefined1  [16])0x0,auVar264);
        auVar119 = vshufps_avx(auVar62,auVar62,0xe8);
        auVar132 = vshufps_avx(auVar93,auVar93,0xe8);
        auVar141 = ZEXT1664(auVar132);
        auVar122 = vcmpps_avx(auVar119,auVar132,1);
        uVar54 = vextractps_avx(auVar122,0);
        auVar131 = auVar93;
        if ((uVar54 & 1) == 0) {
          auVar131 = auVar62;
        }
        auVar63 = vmaxss_avx(auVar131,auVar63);
        auVar243 = vminps_avx(auVar243,auVar65);
        auVar65 = vminps_avx(auVar119,auVar132);
        auVar65 = vminps_avx(auVar243,auVar65);
        auVar125 = vshufps_avx(auVar125,auVar125,0x55);
        auVar125 = vblendps_avx(auVar125,auVar122,2);
        auVar122 = vpslld_avx(auVar125,0x1f);
        auVar125 = vshufpd_avx(auVar234,auVar234,1);
        auVar125 = vinsertps_avx(auVar125,auVar93,0x9c);
        auVar243 = vshufpd_avx(auVar64,auVar64,1);
        auVar243 = vinsertps_avx(auVar243,auVar62,0x9c);
        auVar125 = vblendvps_avx(auVar243,auVar125,auVar122);
        auVar243 = vmovshdup_avx(auVar125);
        auVar125 = vmaxss_avx(auVar243,auVar125);
        fVar61 = auVar65._0_4_;
        auVar243 = vmovshdup_avx(auVar65);
        fVar59 = auVar125._0_4_;
        fVar118 = auVar243._0_4_;
        fVar91 = auVar63._0_4_;
        if (((fVar61 < 0.0001) && (-0.0001 < fVar59)) || (fVar118 < 0.0001 && -0.0001 < fVar59)) {
LAB_015a457f:
          auVar64 = vcmpps_avx(auVar65,_DAT_01f7aa10,1);
          auVar234 = SUB6416(ZEXT864(0),0) << 0x20;
          auVar243 = vcmpss_avx(auVar63,ZEXT816(0) << 0x20,1);
          auVar98._8_4_ = 0x3f800000;
          auVar98._0_8_ = 0x3f8000003f800000;
          auVar98._12_4_ = 0x3f800000;
          auVar110._8_4_ = 0xbf800000;
          auVar110._0_8_ = 0xbf800000bf800000;
          auVar110._12_4_ = 0xbf800000;
          auVar243 = vblendvps_avx(auVar98,auVar110,auVar243);
          auVar64 = vblendvps_avx(auVar98,auVar110,auVar64);
          fVar217 = auVar64._0_4_;
          fVar143 = auVar243._0_4_;
          auVar243 = SUB6416(ZEXT864(0),0) << 0x20;
          if ((fVar217 == fVar143) && (!NAN(fVar217) && !NAN(fVar143))) {
            auVar243 = SUB6416(ZEXT464(0x7f800000),0);
          }
          if ((fVar217 == fVar143) && (!NAN(fVar217) && !NAN(fVar143))) {
            auVar234 = SUB6416(ZEXT464(0xff800000),0);
          }
          auVar64 = vmovshdup_avx(auVar64);
          fVar179 = auVar64._0_4_;
          if ((fVar217 != fVar179) || (NAN(fVar217) || NAN(fVar179))) {
            if ((fVar118 != fVar61) || (NAN(fVar118) || NAN(fVar61))) {
              auVar123._0_4_ = (float)((uint)fVar61 ^ local_3f8);
              auVar123._4_4_ = auVar65._4_4_ ^ uStack_3f4;
              auVar123._8_4_ = auVar65._8_4_ ^ uStack_3f0;
              auVar123._12_4_ = auVar65._12_4_ ^ uStack_3ec;
              auVar124._0_4_ = auVar123._0_4_ / (fVar118 - fVar61);
              auVar124._4_12_ = auVar123._4_12_;
              auVar65 = vfmadd132ss_fma(ZEXT416((uint)(1.0 - auVar124._0_4_)),auVar124,ZEXT416(0));
              auVar64 = auVar65;
            }
            else {
              auVar65 = ZEXT816(0) << 0x20;
              if ((fVar61 != 0.0) || (auVar64 = SUB6416(ZEXT464(0x3f800000),0), NAN(fVar61))) {
                auVar65 = SUB6416(ZEXT464(0x7f800000),0);
                auVar64 = SUB6416(ZEXT464(0xff800000),0);
              }
            }
            auVar243 = vminss_avx(auVar243,auVar65);
            auVar234 = vmaxss_avx(auVar64,auVar234);
          }
          auVar125 = vcmpss_avx(auVar125,ZEXT416(0),1);
          auVar99._8_4_ = 0x3f800000;
          auVar99._0_8_ = 0x3f8000003f800000;
          auVar99._12_4_ = 0x3f800000;
          auVar111._8_4_ = 0xbf800000;
          auVar111._0_8_ = 0xbf800000bf800000;
          auVar111._12_4_ = 0xbf800000;
          auVar125 = vblendvps_avx(auVar99,auVar111,auVar125);
          fVar118 = auVar125._0_4_;
          if ((fVar143 != fVar118) || (NAN(fVar143) || NAN(fVar118))) {
            if ((fVar59 != fVar91) || (NAN(fVar59) || NAN(fVar91))) {
              auVar79._0_4_ = (float)((uint)fVar91 ^ local_3f8);
              auVar79._4_4_ = auVar63._4_4_ ^ uStack_3f4;
              auVar79._8_4_ = auVar63._8_4_ ^ uStack_3f0;
              auVar79._12_4_ = auVar63._12_4_ ^ uStack_3ec;
              auVar126._0_4_ = auVar79._0_4_ / (fVar59 - fVar91);
              auVar126._4_12_ = auVar79._4_12_;
              auVar125 = vfmadd132ss_fma(ZEXT416((uint)(1.0 - auVar126._0_4_)),auVar126,ZEXT416(0));
              auVar65 = auVar125;
            }
            else {
              auVar125 = SUB6416(ZEXT464(0x3f800000),0);
              if ((fVar91 != 0.0) || (auVar65 = SUB6416(ZEXT864(0),0) << 0x20, NAN(fVar91))) {
                auVar125 = SUB6416(ZEXT464(0xff800000),0);
                auVar65 = SUB6416(ZEXT464(0x7f800000),0);
              }
            }
            auVar243 = vminss_avx(auVar243,auVar65);
            auVar234 = vmaxss_avx(auVar125,auVar234);
          }
          if ((fVar179 != fVar118) || (NAN(fVar179) || NAN(fVar118))) {
            auVar243 = vminss_avx(auVar243,SUB6416(ZEXT464(0x3f800000),0));
            auVar234 = vmaxss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar234);
          }
          auVar125 = vmaxss_avx(ZEXT816(0) << 0x40,auVar243);
          auVar243 = vminss_avx(auVar234,SUB6416(ZEXT464(0x3f800000),0));
          if (auVar125._0_4_ <= auVar243._0_4_) {
            auVar125 = vmaxss_avx(ZEXT816(0),ZEXT416((uint)(auVar125._0_4_ + -0.1)));
            auVar243 = vminss_avx(ZEXT416((uint)(auVar243._0_4_ + 0.1)),
                                  SUB6416(ZEXT464(0x3f800000),0));
            auVar137._0_8_ = auVar94._0_8_;
            auVar137._8_8_ = auVar137._0_8_;
            auVar208._8_8_ = auVar97._0_8_;
            auVar208._0_8_ = auVar97._0_8_;
            auVar222._8_8_ = local_1f8._0_8_;
            auVar222._0_8_ = local_1f8._0_8_;
            auVar65 = vshufpd_avx(auVar97,auVar97,3);
            auVar64 = vshufpd_avx(local_1f8._0_16_,local_1f8._0_16_,3);
            auVar234 = vshufps_avx(auVar125,auVar243,0);
            auVar80._8_4_ = 0x3f800000;
            auVar80._0_8_ = 0x3f8000003f800000;
            auVar80._12_4_ = 0x3f800000;
            auVar94 = vsubps_avx(auVar80,auVar234);
            local_338._0_4_ = auVar10._0_4_;
            local_338._4_4_ = auVar10._4_4_;
            fStack_330 = auVar10._8_4_;
            fStack_32c = auVar10._12_4_;
            fVar118 = auVar234._0_4_;
            auVar81._0_4_ = fVar118 * (float)local_338._0_4_;
            fVar91 = auVar234._4_4_;
            auVar81._4_4_ = fVar91 * (float)local_338._4_4_;
            fVar59 = auVar234._8_4_;
            auVar81._8_4_ = fVar59 * fStack_330;
            fVar61 = auVar234._12_4_;
            auVar81._12_4_ = fVar61 * fStack_32c;
            auVar175._0_4_ = fVar118 * auVar65._0_4_;
            auVar175._4_4_ = fVar91 * auVar65._4_4_;
            auVar175._8_4_ = fVar59 * auVar65._8_4_;
            auVar175._12_4_ = fVar61 * auVar65._12_4_;
            auVar184._0_4_ = fVar118 * auVar64._0_4_;
            auVar184._4_4_ = fVar91 * auVar64._4_4_;
            auVar184._8_4_ = fVar59 * auVar64._8_4_;
            auVar184._12_4_ = fVar61 * auVar64._12_4_;
            auVar200._0_4_ = fVar118 * auVar11._0_4_;
            auVar200._4_4_ = fVar91 * auVar11._4_4_;
            auVar200._8_4_ = fVar59 * auVar11._8_4_;
            auVar200._12_4_ = fVar61 * auVar11._12_4_;
            auVar65 = vfmadd231ps_fma(auVar81,auVar94,auVar137);
            auVar64 = vfmadd231ps_fma(auVar175,auVar94,auVar208);
            auVar234 = vfmadd231ps_fma(auVar184,auVar94,auVar222);
            auVar94 = vfmadd231ps_fma(auVar200,auVar94,ZEXT816(0));
            auVar10 = vmovshdup_avx(auVar242);
            auVar62 = vfmadd231ss_fma(ZEXT416((uint)(auVar10._0_4_ * auVar125._0_4_)),auVar242,
                                      ZEXT416((uint)(1.0 - auVar125._0_4_)));
            auVar93 = vfmadd231ss_fma(ZEXT416((uint)(auVar10._0_4_ * auVar243._0_4_)),auVar242,
                                      ZEXT416((uint)(1.0 - auVar243._0_4_)));
            fVar118 = 1.0 / fVar58;
            auVar125 = vsubps_avx(auVar64,auVar65);
            auVar209._0_4_ = auVar125._0_4_ * 3.0;
            auVar209._4_4_ = auVar125._4_4_ * 3.0;
            auVar209._8_4_ = auVar125._8_4_ * 3.0;
            auVar209._12_4_ = auVar125._12_4_ * 3.0;
            auVar125 = vsubps_avx(auVar234,auVar64);
            auVar223._0_4_ = auVar125._0_4_ * 3.0;
            auVar223._4_4_ = auVar125._4_4_ * 3.0;
            auVar223._8_4_ = auVar125._8_4_ * 3.0;
            auVar223._12_4_ = auVar125._12_4_ * 3.0;
            auVar125 = vsubps_avx(auVar94,auVar234);
            auVar235._0_4_ = auVar125._0_4_ * 3.0;
            auVar235._4_4_ = auVar125._4_4_ * 3.0;
            auVar235._8_4_ = auVar125._8_4_ * 3.0;
            auVar235._12_4_ = auVar125._12_4_ * 3.0;
            auVar10 = vminps_avx(auVar223,auVar235);
            auVar125 = vmaxps_avx(auVar223,auVar235);
            auVar10 = vminps_avx(auVar209,auVar10);
            auVar125 = vmaxps_avx(auVar209,auVar125);
            auVar11 = vshufpd_avx(auVar10,auVar10,3);
            auVar243 = vshufpd_avx(auVar125,auVar125,3);
            auVar10 = vminps_avx(auVar10,auVar11);
            auVar125 = vmaxps_avx(auVar125,auVar243);
            auVar224._0_4_ = auVar10._0_4_ * fVar118;
            auVar224._4_4_ = auVar10._4_4_ * fVar118;
            auVar224._8_4_ = auVar10._8_4_ * fVar118;
            auVar224._12_4_ = auVar10._12_4_ * fVar118;
            auVar210._0_4_ = auVar125._0_4_ * fVar118;
            auVar210._4_4_ = auVar125._4_4_ * fVar118;
            auVar210._8_4_ = auVar125._8_4_ * fVar118;
            auVar210._12_4_ = auVar125._12_4_ * fVar118;
            fVar118 = 1.0 / (auVar93._0_4_ - auVar62._0_4_);
            auVar125 = vshufpd_avx(auVar65,auVar65,3);
            auVar10 = vshufpd_avx(auVar64,auVar64,3);
            auVar11 = vshufpd_avx(auVar234,auVar234,3);
            auVar243 = vshufpd_avx(auVar94,auVar94,3);
            auVar125 = vsubps_avx(auVar125,auVar65);
            auVar65 = vsubps_avx(auVar10,auVar64);
            auVar64 = vsubps_avx(auVar11,auVar234);
            auVar243 = vsubps_avx(auVar243,auVar94);
            auVar10 = vminps_avx(auVar125,auVar65);
            auVar125 = vmaxps_avx(auVar125,auVar65);
            auVar11 = vminps_avx(auVar64,auVar243);
            auVar11 = vminps_avx(auVar10,auVar11);
            auVar10 = vmaxps_avx(auVar64,auVar243);
            auVar125 = vmaxps_avx(auVar125,auVar10);
            auVar255._0_4_ = fVar118 * auVar11._0_4_;
            auVar255._4_4_ = fVar118 * auVar11._4_4_;
            auVar255._8_4_ = fVar118 * auVar11._8_4_;
            auVar255._12_4_ = fVar118 * auVar11._12_4_;
            auVar244._0_4_ = fVar118 * auVar125._0_4_;
            auVar244._4_4_ = fVar118 * auVar125._4_4_;
            auVar244._8_4_ = fVar118 * auVar125._8_4_;
            auVar244._12_4_ = fVar118 * auVar125._12_4_;
            auVar243 = vinsertps_avx(auVar12,auVar62,0x10);
            auVar65 = vinsertps_avx(auVar9,auVar93,0x10);
            auVar236._0_4_ = (auVar243._0_4_ + auVar65._0_4_) * 0.5;
            auVar236._4_4_ = (auVar243._4_4_ + auVar65._4_4_) * 0.5;
            auVar236._8_4_ = (auVar243._8_4_ + auVar65._8_4_) * 0.5;
            auVar236._12_4_ = (auVar243._12_4_ + auVar65._12_4_) * 0.5;
            auVar82._4_4_ = auVar236._0_4_;
            auVar82._0_4_ = auVar236._0_4_;
            auVar82._8_4_ = auVar236._0_4_;
            auVar82._12_4_ = auVar236._0_4_;
            auVar125 = vfmadd213ps_fma(local_208,auVar82,local_488);
            auVar10 = vfmadd213ps_fma(local_218,auVar82,_local_518);
            auVar11 = vfmadd213ps_fma(local_228,auVar82,local_478);
            auVar9 = vsubps_avx(auVar10,auVar125);
            auVar125 = vfmadd213ps_fma(auVar9,auVar82,auVar125);
            auVar9 = vsubps_avx(auVar11,auVar10);
            auVar9 = vfmadd213ps_fma(auVar9,auVar82,auVar10);
            auVar9 = vsubps_avx(auVar9,auVar125);
            auVar125 = vfmadd231ps_fma(auVar125,auVar9,auVar82);
            auVar83._0_8_ = CONCAT44(auVar9._4_4_ * 3.0,auVar9._0_4_ * 3.0);
            auVar83._8_4_ = auVar9._8_4_ * 3.0;
            auVar83._12_4_ = auVar9._12_4_ * 3.0;
            auVar265._8_8_ = auVar125._0_8_;
            auVar265._0_8_ = auVar125._0_8_;
            auVar9 = vshufpd_avx(auVar125,auVar125,3);
            auVar125 = vshufps_avx(auVar236,auVar236,0x55);
            auVar234 = vsubps_avx(auVar9,auVar265);
            auVar63 = vfmadd231ps_fma(auVar265,auVar125,auVar234);
            auVar270._8_8_ = auVar83._0_8_;
            auVar270._0_8_ = auVar83._0_8_;
            auVar9 = vshufpd_avx(auVar83,auVar83,3);
            auVar9 = vsubps_avx(auVar9,auVar270);
            auVar94 = vfmadd213ps_fma(auVar9,auVar125,auVar270);
            auVar125 = vmovshdup_avx(auVar94);
            auVar271._0_8_ = auVar125._0_8_ ^ 0x8000000080000000;
            auVar271._8_4_ = auVar125._8_4_ ^ 0x80000000;
            auVar271._12_4_ = auVar125._12_4_ ^ 0x80000000;
            auVar10 = vmovshdup_avx(auVar234);
            auVar9 = vunpcklps_avx(auVar10,auVar271);
            auVar11 = vshufps_avx(auVar9,auVar271,4);
            auVar64 = vshufps_avx(auVar236,auVar236,0x54);
            auVar127._0_8_ = auVar234._0_8_ ^ 0x8000000080000000;
            auVar127._8_4_ = auVar234._8_4_ ^ 0x80000000;
            auVar127._12_4_ = auVar234._12_4_ ^ 0x80000000;
            auVar9 = vmovlhps_avx(auVar127,auVar94);
            auVar9 = vshufps_avx(auVar9,auVar94,8);
            auVar125 = vfmsub231ss_fma(ZEXT416((uint)(auVar234._0_4_ * auVar125._0_4_)),auVar10,
                                       auVar94);
            uVar60 = auVar125._0_4_;
            auVar84._4_4_ = uVar60;
            auVar84._0_4_ = uVar60;
            auVar84._8_4_ = uVar60;
            auVar84._12_4_ = uVar60;
            auVar125 = vdivps_avx(auVar11,auVar84);
            auVar10 = vdivps_avx(auVar9,auVar84);
            fVar59 = auVar63._0_4_;
            fVar118 = auVar125._0_4_;
            auVar9 = vshufps_avx(auVar63,auVar63,0x55);
            fVar91 = auVar10._0_4_;
            auVar85._0_4_ = fVar59 * fVar118 + auVar9._0_4_ * fVar91;
            auVar85._4_4_ = fVar59 * auVar125._4_4_ + auVar9._4_4_ * auVar10._4_4_;
            auVar85._8_4_ = fVar59 * auVar125._8_4_ + auVar9._8_4_ * auVar10._8_4_;
            auVar85._12_4_ = fVar59 * auVar125._12_4_ + auVar9._12_4_ * auVar10._12_4_;
            auVar132 = vsubps_avx(auVar64,auVar85);
            auVar64 = vmovshdup_avx(auVar125);
            auVar9 = vinsertps_avx(auVar224,auVar255,0x1c);
            auVar153._0_4_ = auVar64._0_4_ * auVar9._0_4_;
            auVar153._4_4_ = auVar64._4_4_ * auVar9._4_4_;
            auVar153._8_4_ = auVar64._8_4_ * auVar9._8_4_;
            auVar153._12_4_ = auVar64._12_4_ * auVar9._12_4_;
            auVar11 = vinsertps_avx(auVar210,auVar244,0x1c);
            auVar100._0_4_ = auVar11._0_4_ * auVar64._0_4_;
            auVar100._4_4_ = auVar11._4_4_ * auVar64._4_4_;
            auVar100._8_4_ = auVar11._8_4_ * auVar64._8_4_;
            auVar100._12_4_ = auVar11._12_4_ * auVar64._12_4_;
            auVar63 = vminps_avx(auVar153,auVar100);
            auVar94 = vmaxps_avx(auVar100,auVar153);
            auVar64 = vinsertps_avx(auVar255,auVar224,0x4c);
            auVar122 = vmovshdup_avx(auVar10);
            auVar234 = vinsertps_avx(auVar244,auVar210,0x4c);
            auVar245._0_4_ = auVar122._0_4_ * auVar64._0_4_;
            auVar245._4_4_ = auVar122._4_4_ * auVar64._4_4_;
            auVar245._8_4_ = auVar122._8_4_ * auVar64._8_4_;
            auVar245._12_4_ = auVar122._12_4_ * auVar64._12_4_;
            auVar225._0_4_ = auVar122._0_4_ * auVar234._0_4_;
            auVar225._4_4_ = auVar122._4_4_ * auVar234._4_4_;
            auVar225._8_4_ = auVar122._8_4_ * auVar234._8_4_;
            auVar225._12_4_ = auVar122._12_4_ * auVar234._12_4_;
            auVar122 = vminps_avx(auVar245,auVar225);
            auVar256._0_4_ = auVar63._0_4_ + auVar122._0_4_;
            auVar256._4_4_ = auVar63._4_4_ + auVar122._4_4_;
            auVar256._8_4_ = auVar63._8_4_ + auVar122._8_4_;
            auVar256._12_4_ = auVar63._12_4_ + auVar122._12_4_;
            auVar63 = vmaxps_avx(auVar225,auVar245);
            auVar101._0_4_ = auVar63._0_4_ + auVar94._0_4_;
            auVar101._4_4_ = auVar63._4_4_ + auVar94._4_4_;
            auVar101._8_4_ = auVar63._8_4_ + auVar94._8_4_;
            auVar101._12_4_ = auVar63._12_4_ + auVar94._12_4_;
            auVar226._8_8_ = 0x3f80000000000000;
            auVar226._0_8_ = 0x3f80000000000000;
            auVar94 = vsubps_avx(auVar226,auVar101);
            auVar63 = vsubps_avx(auVar226,auVar256);
            auVar122 = vsubps_avx(auVar243,auVar236);
            auVar119 = vsubps_avx(auVar65,auVar236);
            auVar112._0_4_ = fVar118 * auVar9._0_4_;
            auVar112._4_4_ = fVar118 * auVar9._4_4_;
            auVar112._8_4_ = fVar118 * auVar9._8_4_;
            auVar112._12_4_ = fVar118 * auVar9._12_4_;
            auVar257._0_4_ = fVar118 * auVar11._0_4_;
            auVar257._4_4_ = fVar118 * auVar11._4_4_;
            auVar257._8_4_ = fVar118 * auVar11._8_4_;
            auVar257._12_4_ = fVar118 * auVar11._12_4_;
            auVar11 = vminps_avx(auVar112,auVar257);
            auVar9 = vmaxps_avx(auVar257,auVar112);
            auVar154._0_4_ = fVar91 * auVar64._0_4_;
            auVar154._4_4_ = fVar91 * auVar64._4_4_;
            auVar154._8_4_ = fVar91 * auVar64._8_4_;
            auVar154._12_4_ = fVar91 * auVar64._12_4_;
            auVar211._0_4_ = fVar91 * auVar234._0_4_;
            auVar211._4_4_ = fVar91 * auVar234._4_4_;
            auVar211._8_4_ = fVar91 * auVar234._8_4_;
            auVar211._12_4_ = fVar91 * auVar234._12_4_;
            auVar64 = vminps_avx(auVar154,auVar211);
            auVar258._0_4_ = auVar11._0_4_ + auVar64._0_4_;
            auVar258._4_4_ = auVar11._4_4_ + auVar64._4_4_;
            auVar258._8_4_ = auVar11._8_4_ + auVar64._8_4_;
            auVar258._12_4_ = auVar11._12_4_ + auVar64._12_4_;
            fVar179 = auVar122._0_4_;
            auVar266._0_4_ = fVar179 * auVar94._0_4_;
            fVar192 = auVar122._4_4_;
            auVar266._4_4_ = fVar192 * auVar94._4_4_;
            fVar193 = auVar122._8_4_;
            auVar266._8_4_ = fVar193 * auVar94._8_4_;
            fVar194 = auVar122._12_4_;
            auVar266._12_4_ = fVar194 * auVar94._12_4_;
            auVar11 = vmaxps_avx(auVar211,auVar154);
            auVar212._0_4_ = fVar179 * auVar63._0_4_;
            auVar212._4_4_ = fVar192 * auVar63._4_4_;
            auVar212._8_4_ = fVar193 * auVar63._8_4_;
            auVar212._12_4_ = fVar194 * auVar63._12_4_;
            fVar59 = auVar119._0_4_;
            auVar102._0_4_ = fVar59 * auVar94._0_4_;
            fVar61 = auVar119._4_4_;
            auVar102._4_4_ = fVar61 * auVar94._4_4_;
            fVar143 = auVar119._8_4_;
            auVar102._8_4_ = fVar143 * auVar94._8_4_;
            fVar217 = auVar119._12_4_;
            auVar102._12_4_ = fVar217 * auVar94._12_4_;
            auVar227._0_4_ = fVar59 * auVar63._0_4_;
            auVar227._4_4_ = fVar61 * auVar63._4_4_;
            auVar227._8_4_ = fVar143 * auVar63._8_4_;
            auVar227._12_4_ = fVar217 * auVar63._12_4_;
            auVar113._0_4_ = auVar9._0_4_ + auVar11._0_4_;
            auVar113._4_4_ = auVar9._4_4_ + auVar11._4_4_;
            auVar113._8_4_ = auVar9._8_4_ + auVar11._8_4_;
            auVar113._12_4_ = auVar9._12_4_ + auVar11._12_4_;
            auVar155._8_8_ = 0x3f800000;
            auVar155._0_8_ = 0x3f800000;
            auVar9 = vsubps_avx(auVar155,auVar113);
            auVar11 = vsubps_avx(auVar155,auVar258);
            auVar259._0_4_ = fVar179 * auVar9._0_4_;
            auVar259._4_4_ = fVar192 * auVar9._4_4_;
            auVar259._8_4_ = fVar193 * auVar9._8_4_;
            auVar259._12_4_ = fVar194 * auVar9._12_4_;
            auVar246._0_4_ = fVar179 * auVar11._0_4_;
            auVar246._4_4_ = fVar192 * auVar11._4_4_;
            auVar246._8_4_ = fVar193 * auVar11._8_4_;
            auVar246._12_4_ = fVar194 * auVar11._12_4_;
            auVar114._0_4_ = fVar59 * auVar9._0_4_;
            auVar114._4_4_ = fVar61 * auVar9._4_4_;
            auVar114._8_4_ = fVar143 * auVar9._8_4_;
            auVar114._12_4_ = fVar217 * auVar9._12_4_;
            auVar156._0_4_ = fVar59 * auVar11._0_4_;
            auVar156._4_4_ = fVar61 * auVar11._4_4_;
            auVar156._8_4_ = fVar143 * auVar11._8_4_;
            auVar156._12_4_ = fVar217 * auVar11._12_4_;
            auVar9 = vminps_avx(auVar259,auVar246);
            auVar11 = vminps_avx(auVar114,auVar156);
            auVar9 = vminps_avx(auVar9,auVar11);
            auVar11 = vmaxps_avx(auVar246,auVar259);
            auVar64 = vmaxps_avx(auVar156,auVar114);
            auVar234 = vminps_avx(auVar266,auVar212);
            auVar94 = vminps_avx(auVar102,auVar227);
            auVar234 = vminps_avx(auVar234,auVar94);
            auVar9 = vhaddps_avx(auVar9,auVar234);
            auVar11 = vmaxps_avx(auVar64,auVar11);
            auVar64 = vmaxps_avx(auVar212,auVar266);
            auVar234 = vmaxps_avx(auVar227,auVar102);
            auVar64 = vmaxps_avx(auVar234,auVar64);
            auVar11 = vhaddps_avx(auVar11,auVar64);
            auVar9 = vshufps_avx(auVar9,auVar9,0xe8);
            auVar11 = vshufps_avx(auVar11,auVar11,0xe8);
            auVar228._0_4_ = auVar132._0_4_ + auVar9._0_4_;
            auVar228._4_4_ = auVar132._4_4_ + auVar9._4_4_;
            auVar228._8_4_ = auVar132._8_4_ + auVar9._8_4_;
            auVar228._12_4_ = auVar132._12_4_ + auVar9._12_4_;
            auVar213._0_4_ = auVar132._0_4_ + auVar11._0_4_;
            auVar213._4_4_ = auVar132._4_4_ + auVar11._4_4_;
            auVar213._8_4_ = auVar132._8_4_ + auVar11._8_4_;
            auVar213._12_4_ = auVar132._12_4_ + auVar11._12_4_;
            auVar141 = ZEXT1664(auVar213);
            auVar9 = vmaxps_avx(auVar243,auVar228);
            auVar11 = vminps_avx(auVar213,auVar65);
            auVar9 = vcmpps_avx(auVar11,auVar9,1);
            auVar9 = vshufps_avx(auVar9,auVar9,0x50);
            if ((auVar9 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                -1 < auVar9[0xf]) {
              bVar52 = 0;
              if ((auVar190._0_4_ < auVar228._0_4_) && (bVar52 = 0, auVar213._0_4_ < auVar65._0_4_))
              {
                auVar11 = vmovshdup_avx(auVar228);
                auVar9 = vcmpps_avx(auVar213,auVar65,1);
                bVar52 = auVar9[4] & auVar62._0_4_ < auVar11._0_4_;
              }
              if (((3 < uVar55 || fVar58 < 0.001) | bVar52) != 1) goto LAB_015a5109;
              lVar51 = 200;
              do {
                fVar61 = auVar132._0_4_;
                fVar59 = 1.0 - fVar61;
                fVar58 = fVar59 * fVar59 * fVar59;
                fVar90 = fVar61 * 3.0 * fVar59 * fVar59;
                fVar59 = fVar59 * fVar61 * fVar61 * 3.0;
                auVar138._4_4_ = fVar58;
                auVar138._0_4_ = fVar58;
                auVar138._8_4_ = fVar58;
                auVar138._12_4_ = fVar58;
                auVar115._4_4_ = fVar90;
                auVar115._0_4_ = fVar90;
                auVar115._8_4_ = fVar90;
                auVar115._12_4_ = fVar90;
                auVar103._4_4_ = fVar59;
                auVar103._0_4_ = fVar59;
                auVar103._8_4_ = fVar59;
                auVar103._12_4_ = fVar59;
                fVar61 = fVar61 * fVar61 * fVar61;
                auVar157._0_4_ = fVar61 * (float)local_378._0_4_;
                auVar157._4_4_ = fVar61 * (float)local_378._4_4_;
                auVar157._8_4_ = fVar61 * fStack_370;
                auVar157._12_4_ = fVar61 * fStack_36c;
                auVar12 = vfmadd231ps_fma(auVar157,auVar103,local_478);
                auVar12 = vfmadd231ps_fma(auVar12,auVar115,_local_518);
                auVar12 = vfmadd231ps_fma(auVar12,local_488,auVar138);
                auVar104._8_8_ = auVar12._0_8_;
                auVar104._0_8_ = auVar12._0_8_;
                auVar12 = vshufpd_avx(auVar12,auVar12,3);
                auVar9 = vshufps_avx(auVar132,auVar132,0x55);
                auVar12 = vsubps_avx(auVar12,auVar104);
                auVar9 = vfmadd213ps_fma(auVar12,auVar9,auVar104);
                fVar58 = auVar9._0_4_;
                auVar12 = vshufps_avx(auVar9,auVar9,0x55);
                auVar105._0_4_ = fVar118 * fVar58 + fVar91 * auVar12._0_4_;
                auVar105._4_4_ = auVar125._4_4_ * fVar58 + auVar10._4_4_ * auVar12._4_4_;
                auVar105._8_4_ = auVar125._8_4_ * fVar58 + auVar10._8_4_ * auVar12._8_4_;
                auVar105._12_4_ = auVar125._12_4_ * fVar58 + auVar10._12_4_ * auVar12._12_4_;
                auVar132 = vsubps_avx(auVar132,auVar105);
                auVar12 = vandps_avx(local_2f8,auVar9);
                auVar9 = vshufps_avx(auVar12,auVar12,0xf5);
                auVar12 = vmaxss_avx(auVar9,auVar12);
                if (auVar12._0_4_ < (float)local_388._0_4_) {
                  fVar58 = auVar132._0_4_;
                  if ((0.0 <= fVar58) && (fVar58 <= 1.0)) {
                    auVar12 = vmovshdup_avx(auVar132);
                    fVar90 = auVar12._0_4_;
                    if ((0.0 <= fVar90) && (fVar90 <= 1.0)) {
                      auVar12 = vinsertps_avx(ZEXT416((uint)(pre->ray_space).vx.field_0.m128[2]),
                                              ZEXT416((uint)(pre->ray_space).vy.field_0.m128[2]),
                                              0x1c);
                      auVar64 = vinsertps_avx(auVar12,ZEXT416((uint)(pre->ray_space).vz.field_0.m128
                                                                    [2]),0x28);
                      aVar1 = (ray->super_RayK<1>).org.field_0;
                      auVar12 = vsubps_avx(local_408,(undefined1  [16])aVar1);
                      auVar12 = vdpps_avx(auVar12,auVar64,0x7f);
                      auVar9 = vsubps_avx(local_438,(undefined1  [16])aVar1);
                      auVar9 = vdpps_avx(auVar9,auVar64,0x7f);
                      auVar125 = vsubps_avx(local_448,(undefined1  [16])aVar1);
                      auVar125 = vdpps_avx(auVar125,auVar64,0x7f);
                      auVar10 = vsubps_avx(local_428,(undefined1  [16])aVar1);
                      auVar10 = vdpps_avx(auVar10,auVar64,0x7f);
                      auVar11 = vsubps_avx(_local_418,(undefined1  [16])aVar1);
                      auVar11 = vdpps_avx(auVar11,auVar64,0x7f);
                      auVar243 = vsubps_avx(_local_458,(undefined1  [16])aVar1);
                      auVar243 = vdpps_avx(auVar243,auVar64,0x7f);
                      auVar65 = vsubps_avx(_local_468,(undefined1  [16])aVar1);
                      auVar65 = vdpps_avx(auVar65,auVar64,0x7f);
                      auVar44._4_4_ = fStack_494;
                      auVar44._0_4_ = local_498;
                      auVar44._8_4_ = fStack_490;
                      auVar44._12_4_ = fStack_48c;
                      auVar234 = vsubps_avx(auVar44,(undefined1  [16])aVar1);
                      auVar64 = vdpps_avx(auVar234,auVar64,0x7f);
                      fVar118 = 1.0 - fVar90;
                      auVar12 = vfmadd231ss_fma(ZEXT416((uint)(auVar11._0_4_ * fVar90)),
                                                ZEXT416((uint)fVar118),auVar12);
                      auVar9 = vfmadd231ss_fma(ZEXT416((uint)(auVar243._0_4_ * fVar90)),
                                               ZEXT416((uint)fVar118),auVar9);
                      auVar125 = vfmadd231ss_fma(ZEXT416((uint)(auVar65._0_4_ * fVar90)),
                                                 ZEXT416((uint)fVar118),auVar125);
                      auVar141 = ZEXT1664(auVar125);
                      auVar10 = vfmadd231ss_fma(ZEXT416((uint)(fVar90 * auVar64._0_4_)),
                                                ZEXT416((uint)fVar118),auVar10);
                      fVar59 = 1.0 - fVar58;
                      fVar90 = fVar59 * fVar58 * fVar58 * 3.0;
                      fVar143 = fVar58 * fVar58 * fVar58;
                      auVar125 = vfmadd231ss_fma(ZEXT416((uint)(auVar10._0_4_ * fVar143)),
                                                 ZEXT416((uint)fVar90),auVar125);
                      fVar118 = fVar58 * 3.0 * fVar59 * fVar59;
                      auVar9 = vfmadd231ss_fma(auVar125,ZEXT416((uint)fVar118),auVar9);
                      fVar91 = fVar59 * fVar59 * fVar59;
                      auVar12 = vfmadd231ss_fma(auVar9,ZEXT416((uint)fVar91),auVar12);
                      fVar61 = auVar12._0_4_;
                      if ((((ray->super_RayK<1>).org.field_0.m128[3] <= fVar61) &&
                          (fVar217 = (ray->super_RayK<1>).tfar, fVar61 <= fVar217)) &&
                         (pGVar4 = (context->scene->geometries).items[uVar49].ptr,
                         (pGVar4->mask & (ray->super_RayK<1>).mask) != 0)) {
                        auVar12 = vshufps_avx(auVar132,auVar132,0x55);
                        auVar201._8_4_ = 0x3f800000;
                        auVar201._0_8_ = 0x3f8000003f800000;
                        auVar201._12_4_ = 0x3f800000;
                        auVar9 = vsubps_avx(auVar201,auVar12);
                        fVar179 = auVar12._0_4_;
                        auVar214._0_4_ = fVar179 * (float)local_418._0_4_;
                        fVar192 = auVar12._4_4_;
                        auVar214._4_4_ = fVar192 * (float)local_418._4_4_;
                        fVar193 = auVar12._8_4_;
                        auVar214._8_4_ = fVar193 * fStack_410;
                        fVar194 = auVar12._12_4_;
                        auVar214._12_4_ = fVar194 * fStack_40c;
                        auVar229._0_4_ = fVar179 * (float)local_458._0_4_;
                        auVar229._4_4_ = fVar192 * (float)local_458._4_4_;
                        auVar229._8_4_ = fVar193 * fStack_450;
                        auVar229._12_4_ = fVar194 * fStack_44c;
                        auVar237._0_4_ = fVar179 * (float)local_468._0_4_;
                        auVar237._4_4_ = fVar192 * (float)local_468._4_4_;
                        auVar237._8_4_ = fVar193 * fStack_460;
                        auVar237._12_4_ = fVar194 * fStack_45c;
                        auVar185._0_4_ = fVar179 * local_498;
                        auVar185._4_4_ = fVar192 * fStack_494;
                        auVar185._8_4_ = fVar193 * fStack_490;
                        auVar185._12_4_ = fVar194 * fStack_48c;
                        auVar12 = vfmadd231ps_fma(auVar214,auVar9,local_408);
                        auVar125 = vfmadd231ps_fma(auVar229,auVar9,local_438);
                        auVar10 = vfmadd231ps_fma(auVar237,auVar9,local_448);
                        auVar11 = vfmadd231ps_fma(auVar185,auVar9,local_428);
                        auVar12 = vsubps_avx(auVar125,auVar12);
                        auVar9 = vsubps_avx(auVar10,auVar125);
                        auVar141 = ZEXT1664(auVar9);
                        auVar125 = vsubps_avx(auVar11,auVar10);
                        auVar238._0_4_ = fVar58 * auVar9._0_4_;
                        auVar238._4_4_ = fVar58 * auVar9._4_4_;
                        auVar238._8_4_ = fVar58 * auVar9._8_4_;
                        auVar238._12_4_ = fVar58 * auVar9._12_4_;
                        auVar176._4_4_ = fVar59;
                        auVar176._0_4_ = fVar59;
                        auVar176._8_4_ = fVar59;
                        auVar176._12_4_ = fVar59;
                        auVar12 = vfmadd231ps_fma(auVar238,auVar176,auVar12);
                        auVar186._0_4_ = fVar58 * auVar125._0_4_;
                        auVar186._4_4_ = fVar58 * auVar125._4_4_;
                        auVar186._8_4_ = fVar58 * auVar125._8_4_;
                        auVar186._12_4_ = fVar58 * auVar125._12_4_;
                        auVar125 = vfmadd231ps_fma(auVar186,auVar176,auVar9);
                        auVar187._0_4_ = fVar58 * auVar125._0_4_;
                        auVar187._4_4_ = fVar58 * auVar125._4_4_;
                        auVar187._8_4_ = fVar58 * auVar125._8_4_;
                        auVar187._12_4_ = fVar58 * auVar125._12_4_;
                        auVar125 = vfmadd231ps_fma(auVar187,auVar176,auVar12);
                        auVar158._0_4_ = fVar143 * (float)local_278._0_4_;
                        auVar158._4_4_ = fVar143 * (float)local_278._4_4_;
                        auVar158._8_4_ = fVar143 * fStack_270;
                        auVar158._12_4_ = fVar143 * fStack_26c;
                        auVar116._4_4_ = fVar90;
                        auVar116._0_4_ = fVar90;
                        auVar116._8_4_ = fVar90;
                        auVar116._12_4_ = fVar90;
                        auVar12 = vfmadd132ps_fma(auVar116,auVar158,local_268);
                        auVar139._4_4_ = fVar118;
                        auVar139._0_4_ = fVar118;
                        auVar139._8_4_ = fVar118;
                        auVar139._12_4_ = fVar118;
                        auVar12 = vfmadd132ps_fma(auVar139,auVar12,local_258);
                        auVar159._0_4_ = auVar125._0_4_ * 3.0;
                        auVar159._4_4_ = auVar125._4_4_ * 3.0;
                        auVar159._8_4_ = auVar125._8_4_ * 3.0;
                        auVar159._12_4_ = auVar125._12_4_ * 3.0;
                        auVar128._4_4_ = fVar91;
                        auVar128._0_4_ = fVar91;
                        auVar128._8_4_ = fVar91;
                        auVar128._12_4_ = fVar91;
                        auVar125 = vfmadd132ps_fma(auVar128,auVar12,local_248);
                        auVar12 = vshufps_avx(auVar159,auVar159,0xc9);
                        auVar117._0_4_ = auVar125._0_4_ * auVar12._0_4_;
                        auVar117._4_4_ = auVar125._4_4_ * auVar12._4_4_;
                        auVar117._8_4_ = auVar125._8_4_ * auVar12._8_4_;
                        auVar117._12_4_ = auVar125._12_4_ * auVar12._12_4_;
                        auVar12 = vshufps_avx(auVar125,auVar125,0xc9);
                        auVar12 = vfmsub231ps_fma(auVar117,auVar159,auVar12);
                        if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                           (pGVar4->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                          (ray->super_RayK<1>).tfar = fVar61;
                          auVar9 = vshufps_avx(auVar12,auVar12,0xe9);
                          uVar92 = vmovlps_avx(auVar9);
                          *(undefined8 *)&(ray->Ng).field_0 = uVar92;
                          (ray->Ng).field_0.field_0.z = auVar12._0_4_;
                          uVar92 = vmovlps_avx(auVar132);
                          ray->u = (float)(int)uVar92;
                          ray->v = (float)(int)((ulong)uVar92 >> 0x20);
                          ray->primID = (uint)local_4a0;
                          ray->geomID = uVar49;
                          ray->instID[0] = context->user->instID[0];
                          ray->instPrimID[0] = context->user->instPrimID[0];
                        }
                        else {
                          local_508._0_4_ = fVar217;
                          auVar125 = vshufps_avx(auVar12,auVar12,0xe9);
                          local_2b8 = vmovlps_avx(auVar125);
                          local_2b0 = auVar12._0_4_;
                          local_2ac = vmovlps_avx(auVar132);
                          local_2a4 = (uint)local_4a0;
                          local_2a0 = uVar49;
                          local_29c = context->user->instID[0];
                          local_298 = context->user->instPrimID[0];
                          (ray->super_RayK<1>).tfar = fVar61;
                          local_51c = -1;
                          local_368.valid = &local_51c;
                          local_368.geometryUserPtr = pGVar4->userPtr;
                          local_368.context = context->user;
                          local_368.ray = (RTCRayN *)ray;
                          local_368.hit = (RTCHitN *)&local_2b8;
                          local_368.N = 1;
                          if (pGVar4->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_015a4fbd:
                            p_Var5 = context->args->filter;
                            if ((p_Var5 != (RTCFilterFunctionN)0x0) &&
                               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER)
                                 != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                (((pGVar4->field_8).field_0x2 & 0x40) != 0)))) {
                              auVar141 = ZEXT1664(auVar141._0_16_);
                              (*p_Var5)(&local_368);
                              if (*local_368.valid == 0) goto LAB_015a5060;
                            }
                            (((Vec3f *)((long)local_368.ray + 0x30))->field_0).components[0] =
                                 *(float *)local_368.hit;
                            (((Vec3f *)((long)local_368.ray + 0x30))->field_0).field_0.y =
                                 *(float *)(local_368.hit + 4);
                            (((Vec3f *)((long)local_368.ray + 0x30))->field_0).field_0.z =
                                 *(float *)(local_368.hit + 8);
                            *(float *)((long)local_368.ray + 0x3c) = *(float *)(local_368.hit + 0xc)
                            ;
                            *(float *)((long)local_368.ray + 0x40) =
                                 *(float *)(local_368.hit + 0x10);
                            *(float *)((long)local_368.ray + 0x44) =
                                 *(float *)(local_368.hit + 0x14);
                            *(float *)((long)local_368.ray + 0x48) =
                                 *(float *)(local_368.hit + 0x18);
                            *(float *)((long)local_368.ray + 0x4c) =
                                 *(float *)(local_368.hit + 0x1c);
                            *(float *)((long)local_368.ray + 0x50) =
                                 *(float *)(local_368.hit + 0x20);
                          }
                          else {
                            auVar141 = ZEXT1664(auVar9);
                            (*pGVar4->intersectionFilterN)(&local_368);
                            if (*local_368.valid != 0) goto LAB_015a4fbd;
LAB_015a5060:
                            (ray->super_RayK<1>).tfar = (float)local_508._0_4_;
                          }
                        }
                      }
                    }
                  }
                  break;
                }
                lVar51 = lVar51 + -1;
              } while (lVar51 != 0);
            }
          }
        }
        else {
          auVar243 = vcmpps_avx(auVar243,SUB6416(ZEXT464(0x38d1b717),0),5);
          auVar64 = vcmpps_avx(auVar65,SUB6416(ZEXT464(0x38d1b717),0),5);
          auVar243 = vandps_avx(auVar64,auVar243);
          if (-0.0001 < fVar91 && (auVar243 & (undefined1  [16])0x1) == (undefined1  [16])0x0)
          goto LAB_015a457f;
        }
        if (uVar55 == 0) break;
      } while( true );
    }
    fVar58 = (ray->super_RayK<1>).tfar;
    auVar86._4_4_ = fVar58;
    auVar86._0_4_ = fVar58;
    auVar86._8_4_ = fVar58;
    auVar86._12_4_ = fVar58;
    auVar12 = vcmpps_avx(local_288,auVar86,2);
    uVar49 = vmovmskps_avx(auVar12);
    uVar49 = (uint)uVar56 & uVar49;
    if (uVar49 == 0) {
      return;
    }
  } while( true );
LAB_015a5109:
  auVar12 = vinsertps_avx(auVar12,ZEXT416((uint)fVar90),0x10);
  auVar261 = ZEXT1664(auVar12);
  auVar12 = vinsertps_avx(auVar62,ZEXT416((uint)auVar93._0_4_),0x10);
  auVar250 = ZEXT1664(auVar12);
  auVar204 = ZEXT1664(local_4b8);
  auVar161 = ZEXT1664(local_3b8);
  auVar191 = ZEXT1664(local_3c8);
  auVar216 = ZEXT1664(local_3d8);
  auVar141 = ZEXT1664(_local_3e8);
  auVar178 = ZEXT1664(local_4c8);
  auVar230 = ZEXT1664(local_4d8);
  auVar239 = ZEXT1664(local_4e8);
  goto LAB_015a3cc7;
}

Assistant:

static __forceinline void intersect_n(const Precalculations& pre, RayHit& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          
          unsigned int vertexID = geom->curve(primID);
          Vec3ff a0,a1,a2,a3; Vec3fa n0,n1,n2,n3; geom->gather(a0,a1,a2,a3,n0,n1,n2,n3,vertexID);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }
          
          Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,n0,n1,n2,n3,Epilog(ray,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
      }